

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtod.cc
# Opt level: O1

void TestStrtod(void)

{
  int in_ECX;
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  double dVar4;
  undefined8 uVar5;
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  Vector<const_char> buffer_03;
  Vector<const_char> buffer_04;
  Vector<const_char> buffer_05;
  Vector<const_char> buffer_06;
  Vector<const_char> buffer_07;
  Vector<const_char> buffer_08;
  Vector<const_char> buffer_09;
  Vector<const_char> buffer_10;
  Vector<const_char> buffer_11;
  Vector<const_char> buffer_12;
  Vector<const_char> buffer_13;
  Vector<const_char> buffer_14;
  Vector<const_char> buffer_15;
  Vector<const_char> buffer_16;
  Vector<const_char> buffer_17;
  Vector<const_char> buffer_18;
  Vector<const_char> buffer_19;
  Vector<const_char> buffer_20;
  Vector<const_char> buffer_21;
  Vector<const_char> buffer_22;
  Vector<const_char> buffer_23;
  Vector<const_char> buffer_24;
  Vector<const_char> buffer_25;
  Vector<const_char> buffer_26;
  Vector<const_char> buffer_27;
  Vector<const_char> buffer_28;
  Vector<const_char> buffer_29;
  Vector<const_char> buffer_30;
  Vector<const_char> buffer_31;
  Vector<const_char> buffer_32;
  Vector<const_char> buffer_33;
  Vector<const_char> buffer_34;
  Vector<const_char> buffer_35;
  Vector<const_char> buffer_36;
  Vector<const_char> buffer_37;
  Vector<const_char> buffer_38;
  Vector<const_char> buffer_39;
  Vector<const_char> buffer_40;
  Vector<const_char> buffer_41;
  Vector<const_char> buffer_42;
  Vector<const_char> buffer_43;
  Vector<const_char> buffer_44;
  Vector<const_char> buffer_45;
  Vector<const_char> buffer_46;
  Vector<const_char> buffer_47;
  Vector<const_char> buffer_48;
  Vector<const_char> buffer_49;
  Vector<const_char> buffer_50;
  Vector<const_char> buffer_51;
  Vector<const_char> buffer_52;
  Vector<const_char> buffer_53;
  Vector<const_char> buffer_54;
  Vector<const_char> buffer_55;
  Vector<const_char> buffer_56;
  Vector<const_char> buffer_57;
  Vector<const_char> buffer_58;
  Vector<const_char> buffer_59;
  Vector<const_char> buffer_60;
  Vector<const_char> buffer_61;
  Vector<const_char> buffer_62;
  Vector<const_char> buffer_63;
  Vector<const_char> buffer_64;
  Vector<const_char> buffer_65;
  Vector<const_char> buffer_66;
  Vector<const_char> buffer_67;
  Vector<const_char> buffer_68;
  Vector<const_char> buffer_69;
  Vector<const_char> buffer_70;
  Vector<const_char> buffer_71;
  Vector<const_char> buffer_72;
  Vector<const_char> buffer_73;
  Vector<const_char> buffer_74;
  Vector<const_char> buffer_75;
  Vector<const_char> buffer_76;
  Vector<const_char> buffer_77;
  Vector<const_char> buffer_78;
  Vector<const_char> buffer_79;
  Vector<const_char> buffer_80;
  Vector<const_char> buffer_81;
  Vector<const_char> buffer_82;
  Vector<const_char> buffer_83;
  Vector<const_char> buffer_84;
  Vector<const_char> buffer_85;
  Vector<const_char> buffer_86;
  Vector<const_char> buffer_87;
  Vector<const_char> buffer_88;
  Vector<const_char> buffer_89;
  Vector<const_char> buffer_90;
  Vector<const_char> buffer_91;
  Vector<const_char> buffer_92;
  Vector<const_char> buffer_93;
  Vector<const_char> buffer_94;
  Vector<const_char> buffer_95;
  Vector<const_char> buffer_96;
  Vector<const_char> buffer_97;
  Vector<const_char> buffer_98;
  Vector<const_char> buffer_99;
  Vector<const_char> buffer_x00100;
  Vector<const_char> buffer_x00101;
  Vector<const_char> buffer_x00102;
  Vector<const_char> buffer_x00103;
  Vector<const_char> buffer_x00104;
  Vector<const_char> buffer_x00105;
  Vector<const_char> buffer_x00106;
  Vector<const_char> buffer_x00107;
  Vector<const_char> buffer_x00108;
  Vector<const_char> buffer_x00109;
  Vector<const_char> buffer_x00110;
  Vector<const_char> buffer_x00111;
  Vector<const_char> buffer_x00112;
  Vector<const_char> buffer_x00113;
  Vector<const_char> buffer_x00114;
  Vector<const_char> buffer_x00115;
  Vector<const_char> buffer_x00116;
  Vector<const_char> buffer_x00117;
  Vector<const_char> buffer_x00118;
  Vector<const_char> buffer_x00119;
  Vector<const_char> buffer_x00120;
  Vector<const_char> buffer_x00121;
  Vector<const_char> buffer_x00122;
  Vector<const_char> buffer_x00123;
  Vector<const_char> buffer_x00124;
  Vector<const_char> buffer_x00125;
  Vector<const_char> buffer_x00126;
  Vector<const_char> buffer_x00127;
  Vector<const_char> buffer_x00128;
  Vector<const_char> buffer_x00129;
  Vector<const_char> buffer_x00130;
  Vector<const_char> buffer_x00131;
  Vector<const_char> buffer_x00132;
  Vector<const_char> buffer_x00133;
  Vector<const_char> buffer_x00134;
  Vector<const_char> buffer_x00135;
  Vector<const_char> buffer_x00136;
  Vector<const_char> buffer_x00137;
  Vector<const_char> buffer_x00138;
  Vector<const_char> buffer_x00139;
  Vector<const_char> buffer_x00140;
  Vector<const_char> buffer_x00141;
  Vector<const_char> buffer_x00142;
  Vector<const_char> buffer_x00143;
  Vector<const_char> buffer_x00144;
  Vector<const_char> buffer_x00145;
  Vector<const_char> buffer_x00146;
  Vector<const_char> buffer_x00147;
  Vector<const_char> buffer_x00148;
  Vector<const_char> buffer_x00149;
  Vector<const_char> buffer_x00150;
  Vector<const_char> buffer_x00151;
  Vector<const_char> buffer_x00152;
  Vector<const_char> buffer_x00153;
  Vector<const_char> buffer_x00154;
  Vector<const_char> buffer_x00155;
  Vector<const_char> buffer_x00156;
  Vector<const_char> buffer_x00157;
  Vector<const_char> buffer_x00158;
  Vector<const_char> buffer_x00159;
  Vector<const_char> buffer_x00160;
  Vector<const_char> buffer_x00161;
  Vector<const_char> buffer_x00162;
  Vector<const_char> buffer_x00163;
  Vector<const_char> buffer_x00164;
  Vector<const_char> buffer_x00165;
  Vector<const_char> buffer_x00166;
  Vector<const_char> buffer_x00167;
  Vector<const_char> buffer_x00168;
  Vector<const_char> buffer_x00169;
  Vector<const_char> buffer_x00170;
  Vector<const_char> buffer_x00171;
  Vector<const_char> buffer_x00172;
  Vector<const_char> buffer_x00173;
  Vector<const_char> buffer_x00174;
  Vector<const_char> buffer_x00175;
  Vector<const_char> buffer_x00176;
  Vector<const_char> buffer_x00177;
  Vector<const_char> buffer_x00178;
  Vector<const_char> buffer_x00179;
  Vector<const_char> buffer_x00180;
  Vector<const_char> buffer_x00181;
  Vector<const_char> buffer_x00182;
  Vector<const_char> buffer_x00183;
  Vector<const_char> buffer_x00184;
  Vector<const_char> buffer_x00185;
  Vector<const_char> buffer_x00186;
  Vector<const_char> buffer_x00187;
  
  buffer._8_8_ = 1;
  buffer.start_ = (char *)0x1;
  dVar4 = double_conversion::Strtod((double_conversion *)0xc3ed66,buffer,in_ECX);
  uVar5 = 0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0";
    pcVar3 = "Strtod(vector, 1)";
    uVar2 = 0x3f;
  }
  else {
    buffer_00._8_8_ = 2;
    buffer_00.start_ = (char *)0x1;
    dVar4 = double_conversion::Strtod((double_conversion *)0xc3ed66,buffer_00,in_ECX);
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      pcVar1 = "0.0";
      pcVar3 = "Strtod(vector, 2)";
      uVar5 = 0;
      uVar2 = 0x40;
    }
    else {
      buffer_01._8_8_ = 0xfffffffe;
      buffer_01.start_ = (char *)0x1;
      dVar4 = double_conversion::Strtod((double_conversion *)0xc3ed66,buffer_01,in_ECX);
      uVar5 = 0;
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        pcVar1 = "0.0";
        pcVar3 = "Strtod(vector, -2)";
        uVar2 = 0x41;
      }
      else {
        buffer_02._8_8_ = 0xfffffc19;
        buffer_02.start_ = (char *)0x1;
        dVar4 = double_conversion::Strtod((double_conversion *)0xc3ed66,buffer_02,in_ECX);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          pcVar1 = "0.0";
          pcVar3 = "Strtod(vector, -999)";
          uVar5 = 0;
          uVar2 = 0x42;
        }
        else {
          buffer_03._8_8_ = 999;
          buffer_03.start_ = (char *)0x1;
          dVar4 = double_conversion::Strtod((double_conversion *)0xc3ed66,buffer_03,in_ECX);
          uVar5 = 0;
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            pcVar1 = "0.0";
            pcVar3 = "Strtod(vector, +999)";
            uVar2 = 0x43;
          }
          else {
            dVar4 = double_conversion::Strtod
                              ((double_conversion *)0xc3e5f9,(Vector<const_char>)ZEXT816(1),in_ECX);
            if ((dVar4 != 1.0) || (NAN(dVar4))) {
              pcVar1 = "1.0";
              pcVar3 = "Strtod(vector, 0)";
              uVar5 = 0x3ff0000000000000;
              uVar2 = 0x46;
            }
            else {
              buffer_04._8_8_ = 1;
              buffer_04.start_ = (char *)0x1;
              dVar4 = double_conversion::Strtod((double_conversion *)0xc3e5f9,buffer_04,in_ECX);
              if ((dVar4 != 10.0) || (NAN(dVar4))) {
                pcVar1 = "10.0";
                pcVar3 = "Strtod(vector, 1)";
                uVar5 = 0x4024000000000000;
                uVar2 = 0x47;
              }
              else {
                buffer_05._8_8_ = 2;
                buffer_05.start_ = (char *)0x1;
                dVar4 = double_conversion::Strtod((double_conversion *)0xc3e5f9,buffer_05,in_ECX);
                if ((dVar4 != 100.0) || (NAN(dVar4))) {
                  pcVar1 = "100.0";
                  pcVar3 = "Strtod(vector, 2)";
                  uVar5 = 0x4059000000000000;
                  uVar2 = 0x48;
                }
                else {
                  buffer_06._8_8_ = 0x14;
                  buffer_06.start_ = (char *)0x1;
                  dVar4 = double_conversion::Strtod((double_conversion *)0xc3e5f9,buffer_06,in_ECX);
                  if ((dVar4 != 1e+20) || (NAN(dVar4))) {
                    pcVar1 = "1e20";
                    pcVar3 = "Strtod(vector, 20)";
                    uVar5 = 0x4415af1d78b58c40;
                    uVar2 = 0x49;
                  }
                  else {
                    buffer_07._8_8_ = 0x16;
                    buffer_07.start_ = (char *)0x1;
                    dVar4 = double_conversion::Strtod
                                      ((double_conversion *)0xc3e5f9,buffer_07,in_ECX);
                    if ((dVar4 != 1e+22) || (NAN(dVar4))) {
                      pcVar1 = "1e22";
                      pcVar3 = "Strtod(vector, 22)";
                      uVar5 = 0x4480f0cf064dd592;
                      uVar2 = 0x4a;
                    }
                    else {
                      buffer_08._8_8_ = 0x17;
                      buffer_08.start_ = (char *)0x1;
                      dVar4 = double_conversion::Strtod
                                        ((double_conversion *)0xc3e5f9,buffer_08,in_ECX);
                      if ((dVar4 != 1e+23) || (NAN(dVar4))) {
                        pcVar1 = "1e23";
                        pcVar3 = "Strtod(vector, 23)";
                        uVar5 = 0x44b52d02c7e14af6;
                        uVar2 = 0x4b;
                      }
                      else {
                        buffer_09._8_8_ = 0x23;
                        buffer_09.start_ = (char *)0x1;
                        dVar4 = double_conversion::Strtod
                                          ((double_conversion *)0xc3e5f9,buffer_09,in_ECX);
                        if ((dVar4 != 1e+35) || (NAN(dVar4))) {
                          pcVar1 = "1e35";
                          pcVar3 = "Strtod(vector, 35)";
                          uVar5 = 0x4733426172c74d82;
                          uVar2 = 0x4c;
                        }
                        else {
                          buffer_10._8_8_ = 0x24;
                          buffer_10.start_ = (char *)0x1;
                          dVar4 = double_conversion::Strtod
                                            ((double_conversion *)0xc3e5f9,buffer_10,in_ECX);
                          if ((dVar4 != 1e+36) || (NAN(dVar4))) {
                            pcVar1 = "1e36";
                            pcVar3 = "Strtod(vector, 36)";
                            uVar5 = 0x476812f9cf7920e3;
                            uVar2 = 0x4d;
                          }
                          else {
                            buffer_11._8_8_ = 0x25;
                            buffer_11.start_ = (char *)0x1;
                            dVar4 = double_conversion::Strtod
                                              ((double_conversion *)0xc3e5f9,buffer_11,in_ECX);
                            if ((dVar4 != 1e+37) || (NAN(dVar4))) {
                              pcVar1 = "1e37";
                              pcVar3 = "Strtod(vector, 37)";
                              uVar5 = 0x479e17b84357691b;
                              uVar2 = 0x4e;
                            }
                            else {
                              buffer_12._8_8_ = 0xffffffff;
                              buffer_12.start_ = (char *)0x1;
                              dVar4 = double_conversion::Strtod
                                                ((double_conversion *)0xc3e5f9,buffer_12,in_ECX);
                              if ((dVar4 != 0.1) || (NAN(dVar4))) {
                                pcVar1 = "1e-1";
                                pcVar3 = "Strtod(vector, -1)";
                                uVar5 = 0x3fb999999999999a;
                                uVar2 = 0x4f;
                              }
                              else {
                                buffer_13._8_8_ = 0xfffffffe;
                                buffer_13.start_ = (char *)0x1;
                                dVar4 = double_conversion::Strtod
                                                  ((double_conversion *)0xc3e5f9,buffer_13,in_ECX);
                                if ((dVar4 != 0.01) || (NAN(dVar4))) {
                                  pcVar1 = "1e-2";
                                  pcVar3 = "Strtod(vector, -2)";
                                  uVar5 = 0x3f847ae147ae147b;
                                  uVar2 = 0x50;
                                }
                                else {
                                  buffer_14._8_8_ = 0xfffffffb;
                                  buffer_14.start_ = (char *)0x1;
                                  dVar4 = double_conversion::Strtod
                                                    ((double_conversion *)0xc3e5f9,buffer_14,in_ECX)
                                  ;
                                  if ((dVar4 != 1e-05) || (NAN(dVar4))) {
                                    pcVar1 = "1e-5";
                                    pcVar3 = "Strtod(vector, -5)";
                                    uVar5 = 0x3ee4f8b588e368f1;
                                    uVar2 = 0x51;
                                  }
                                  else {
                                    buffer_15._8_8_ = 0xffffffec;
                                    buffer_15.start_ = (char *)0x1;
                                    dVar4 = double_conversion::Strtod
                                                      ((double_conversion *)0xc3e5f9,buffer_15,
                                                       in_ECX);
                                    if ((dVar4 != 1e-20) || (NAN(dVar4))) {
                                      pcVar1 = "1e-20";
                                      pcVar3 = "Strtod(vector, -20)";
                                      uVar5 = 0x3bc79ca10c924223;
                                      uVar2 = 0x52;
                                    }
                                    else {
                                      buffer_16._8_8_ = 0xffffffea;
                                      buffer_16.start_ = (char *)0x1;
                                      dVar4 = double_conversion::Strtod
                                                        ((double_conversion *)0xc3e5f9,buffer_16,
                                                         in_ECX);
                                      if ((dVar4 != 1e-22) || (NAN(dVar4))) {
                                        pcVar1 = "1e-22";
                                        pcVar3 = "Strtod(vector, -22)";
                                        uVar5 = 0x3b5e392010175ee6;
                                        uVar2 = 0x53;
                                      }
                                      else {
                                        buffer_17._8_8_ = 0xffffffe9;
                                        buffer_17.start_ = (char *)0x1;
                                        dVar4 = double_conversion::Strtod
                                                          ((double_conversion *)0xc3e5f9,buffer_17,
                                                           in_ECX);
                                        if ((dVar4 != 1e-23) || (NAN(dVar4))) {
                                          pcVar1 = "1e-23";
                                          pcVar3 = "Strtod(vector, -23)";
                                          uVar5 = 0x3b282db34012b251;
                                          uVar2 = 0x54;
                                        }
                                        else {
                                          buffer_18._8_8_ = 0xffffffe7;
                                          buffer_18.start_ = (char *)0x1;
                                          dVar4 = double_conversion::Strtod
                                                            ((double_conversion *)0xc3e5f9,buffer_18
                                                             ,in_ECX);
                                          if ((dVar4 != 1e-25) || (NAN(dVar4))) {
                                            pcVar1 = "1e-25";
                                            pcVar3 = "Strtod(vector, -25)";
                                            uVar5 = 0x3abef2d0f5da7dd9;
                                            uVar2 = 0x55;
                                          }
                                          else {
                                            buffer_19._8_8_ = 0xffffffd9;
                                            buffer_19.start_ = (char *)0x1;
                                            dVar4 = double_conversion::Strtod
                                                              ((double_conversion *)0xc3e5f9,
                                                               buffer_19,in_ECX);
                                            if ((dVar4 != 1e-39) || (NAN(dVar4))) {
                                              pcVar1 = "1e-39";
                                              pcVar3 = "Strtod(vector, -39)";
                                              uVar5 = 0x37d5c72fb1552d83;
                                              uVar2 = 0x56;
                                            }
                                            else {
                                              dVar4 = double_conversion::Strtod
                                                                ((double_conversion *)0xc3f93b,
                                                                 (Vector<const_char>)ZEXT816(1),
                                                                 in_ECX);
                                              if ((dVar4 != 2.0) || (NAN(dVar4))) {
                                                pcVar1 = "2.0";
                                                pcVar3 = "Strtod(vector, 0)";
                                                uVar5 = 0x4000000000000000;
                                                uVar2 = 0x59;
                                              }
                                              else {
                                                buffer_20._8_8_ = 1;
                                                buffer_20.start_ = (char *)0x1;
                                                dVar4 = double_conversion::Strtod
                                                                  ((double_conversion *)0xc3f93b,
                                                                   buffer_20,in_ECX);
                                                if ((dVar4 != 20.0) || (NAN(dVar4))) {
                                                  pcVar1 = "20.0";
                                                  pcVar3 = "Strtod(vector, 1)";
                                                  uVar5 = 0x4034000000000000;
                                                  uVar2 = 0x5a;
                                                }
                                                else {
                                                  buffer_21._8_8_ = 2;
                                                  buffer_21.start_ = (char *)0x1;
                                                  dVar4 = double_conversion::Strtod
                                                                    ((double_conversion *)0xc3f93b,
                                                                     buffer_21,in_ECX);
                                                  if ((dVar4 != 200.0) || (NAN(dVar4))) {
                                                    pcVar1 = "200.0";
                                                    pcVar3 = "Strtod(vector, 2)";
                                                    uVar5 = 0x4069000000000000;
                                                    uVar2 = 0x5b;
                                                  }
                                                  else {
                                                    buffer_22._8_8_ = 0x14;
                                                    buffer_22.start_ = (char *)0x1;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3f93b
                                                                       ,buffer_22,in_ECX);
                                                    if ((dVar4 != 2e+20) || (NAN(dVar4))) {
                                                      pcVar1 = "2e20";
                                                      pcVar3 = "Strtod(vector, 20)";
                                                      uVar5 = 0x4425af1d78b58c40;
                                                      uVar2 = 0x5c;
                                                    }
                                                    else {
                                                      buffer_23._8_8_ = 0x16;
                                                      buffer_23.start_ = (char *)0x1;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3f93b,buffer_23,in_ECX);
                                                      if ((dVar4 != 2e+22) || (NAN(dVar4))) {
                                                        pcVar1 = "2e22";
                                                        pcVar3 = "Strtod(vector, 22)";
                                                        uVar5 = 0x4490f0cf064dd592;
                                                        uVar2 = 0x5d;
                                                      }
                                                      else {
                                                        buffer_24._8_8_ = 0x17;
                                                        buffer_24.start_ = (char *)0x1;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3f93b,buffer_24,in_ECX
                                                                          );
                                                        if ((dVar4 != 2e+23) || (NAN(dVar4))) {
                                                          pcVar1 = "2e23";
                                                          pcVar3 = "Strtod(vector, 23)";
                                                          uVar5 = 0x44c52d02c7e14af6;
                                                          uVar2 = 0x5e;
                                                        }
                                                        else {
                                                          buffer_25._8_8_ = 0x23;
                                                          buffer_25.start_ = (char *)0x1;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3f93b,buffer_25,
                                                                             in_ECX);
                                                          if ((dVar4 != 2e+35) || (NAN(dVar4))) {
                                                            pcVar1 = "2e35";
                                                            pcVar3 = "Strtod(vector, 35)";
                                                            uVar5 = 0x4743426172c74d82;
                                                            uVar2 = 0x5f;
                                                          }
                                                          else {
                                                            buffer_26._8_8_ = 0x24;
                                                            buffer_26.start_ = (char *)0x1;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc3f93b,buffer_26,
                                                                               in_ECX);
                                                            if ((dVar4 != 2e+36) || (NAN(dVar4))) {
                                                              pcVar1 = "2e36";
                                                              pcVar3 = "Strtod(vector, 36)";
                                                              uVar5 = 0x477812f9cf7920e3;
                                                              uVar2 = 0x60;
                                                            }
                                                            else {
                                                              buffer_27._8_8_ = 0x25;
                                                              buffer_27.start_ = (char *)0x1;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc3f93b,
                                                                                 buffer_27,in_ECX);
                                                              if ((dVar4 != 2e+37) || (NAN(dVar4)))
                                                              {
                                                                pcVar1 = "2e37";
                                                                pcVar3 = "Strtod(vector, 37)";
                                                                uVar5 = 0x47ae17b84357691b;
                                                                uVar2 = 0x61;
                                                              }
                                                              else {
                                                                buffer_28._8_8_ = 0xffffffff;
                                                                buffer_28.start_ = (char *)0x1;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc3f93b,buffer_28,in_ECX);
                                                  if ((dVar4 != 0.2) || (NAN(dVar4))) {
                                                    pcVar1 = "2e-1";
                                                    pcVar3 = "Strtod(vector, -1)";
                                                    uVar5 = 0x3fc999999999999a;
                                                    uVar2 = 0x62;
                                                  }
                                                  else {
                                                    buffer_29._8_8_ = 0xfffffffe;
                                                    buffer_29.start_ = (char *)0x1;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3f93b
                                                                       ,buffer_29,in_ECX);
                                                    if ((dVar4 != 0.02) || (NAN(dVar4))) {
                                                      pcVar1 = "2e-2";
                                                      pcVar3 = "Strtod(vector, -2)";
                                                      uVar5 = 0x3f947ae147ae147b;
                                                      uVar2 = 99;
                                                    }
                                                    else {
                                                      buffer_30._8_8_ = 0xfffffffb;
                                                      buffer_30.start_ = (char *)0x1;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3f93b,buffer_30,in_ECX);
                                                      if ((dVar4 != 2e-05) || (NAN(dVar4))) {
                                                        pcVar1 = "2e-5";
                                                        pcVar3 = "Strtod(vector, -5)";
                                                        uVar5 = 0x3ef4f8b588e368f1;
                                                        uVar2 = 100;
                                                      }
                                                      else {
                                                        buffer_31._8_8_ = 0xffffffec;
                                                        buffer_31.start_ = (char *)0x1;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3f93b,buffer_31,in_ECX
                                                                          );
                                                        if ((dVar4 != 2e-20) || (NAN(dVar4))) {
                                                          pcVar1 = "2e-20";
                                                          pcVar3 = "Strtod(vector, -20)";
                                                          uVar5 = 0x3bd79ca10c924223;
                                                          uVar2 = 0x65;
                                                        }
                                                        else {
                                                          buffer_32._8_8_ = 0xffffffea;
                                                          buffer_32.start_ = (char *)0x1;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3f93b,buffer_32,
                                                                             in_ECX);
                                                          if ((dVar4 != 2e-22) || (NAN(dVar4))) {
                                                            pcVar1 = "2e-22";
                                                            pcVar3 = "Strtod(vector, -22)";
                                                            uVar5 = 0x3b6e392010175ee6;
                                                            uVar2 = 0x66;
                                                          }
                                                          else {
                                                            buffer_33._8_8_ = 0xffffffe9;
                                                            buffer_33.start_ = (char *)0x1;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc3f93b,buffer_33,
                                                                               in_ECX);
                                                            if ((dVar4 != 2e-23) || (NAN(dVar4))) {
                                                              pcVar1 = "2e-23";
                                                              pcVar3 = "Strtod(vector, -23)";
                                                              uVar5 = 0x3b382db34012b251;
                                                              uVar2 = 0x67;
                                                            }
                                                            else {
                                                              buffer_34._8_8_ = 0xffffffe7;
                                                              buffer_34.start_ = (char *)0x1;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc3f93b,
                                                                                 buffer_34,in_ECX);
                                                              if ((dVar4 != 2e-25) || (NAN(dVar4)))
                                                              {
                                                                pcVar1 = "2e-25";
                                                                pcVar3 = "Strtod(vector, -25)";
                                                                uVar5 = 0x3acef2d0f5da7dd9;
                                                                uVar2 = 0x68;
                                                              }
                                                              else {
                                                                buffer_35._8_8_ = 0xffffffd9;
                                                                buffer_35.start_ = (char *)0x1;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc3f93b,buffer_35,in_ECX);
                                                  if ((dVar4 != 2e-39) || (NAN(dVar4))) {
                                                    pcVar1 = "2e-39";
                                                    pcVar3 = "Strtod(vector, -39)";
                                                    uVar5 = 0x37e5c72fb1552d83;
                                                    uVar2 = 0x69;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3eabd
                                                                       ,(Vector<const_char>)
                                                                        ZEXT816(1),in_ECX);
                                                    if ((dVar4 != 9.0) || (NAN(dVar4))) {
                                                      pcVar1 = "9.0";
                                                      pcVar3 = "Strtod(vector, 0)";
                                                      uVar5 = 0x4022000000000000;
                                                      uVar2 = 0x6c;
                                                    }
                                                    else {
                                                      buffer_36._8_8_ = 1;
                                                      buffer_36.start_ = (char *)0x1;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3eabd,buffer_36,in_ECX);
                                                      if ((dVar4 != 90.0) || (NAN(dVar4))) {
                                                        pcVar1 = "90.0";
                                                        pcVar3 = "Strtod(vector, 1)";
                                                        uVar5 = 0x4056800000000000;
                                                        uVar2 = 0x6d;
                                                      }
                                                      else {
                                                        buffer_37._8_8_ = 2;
                                                        buffer_37.start_ = (char *)0x1;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3eabd,buffer_37,in_ECX
                                                                          );
                                                        if ((dVar4 != 900.0) || (NAN(dVar4))) {
                                                          pcVar1 = "900.0";
                                                          pcVar3 = "Strtod(vector, 2)";
                                                          uVar5 = 0x408c200000000000;
                                                          uVar2 = 0x6e;
                                                        }
                                                        else {
                                                          buffer_38._8_8_ = 0x14;
                                                          buffer_38.start_ = (char *)0x1;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3eabd,buffer_38,
                                                                             in_ECX);
                                                          if ((dVar4 != 9e+20) || (NAN(dVar4))) {
                                                            pcVar1 = "9e20";
                                                            pcVar3 = "Strtod(vector, 20)";
                                                            uVar5 = 0x4448650127cc3dc8;
                                                            uVar2 = 0x6f;
                                                          }
                                                          else {
                                                            buffer_39._8_8_ = 0x16;
                                                            buffer_39.start_ = (char *)0x1;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc3eabd,buffer_39,
                                                                               in_ECX);
                                                            if ((dVar4 != 9e+22) || (NAN(dVar4))) {
                                                              pcVar1 = "9e22";
                                                              pcVar3 = "Strtod(vector, 22)";
                                                              uVar5 = 0x44b30ee8e7179044;
                                                              uVar2 = 0x70;
                                                            }
                                                            else {
                                                              buffer_40._8_8_ = 0x17;
                                                              buffer_40.start_ = (char *)0x1;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc3eabd,
                                                                                 buffer_40,in_ECX);
                                                              if ((dVar4 != 9e+23) || (NAN(dVar4)))
                                                              {
                                                                pcVar1 = "9e23";
                                                                pcVar3 = "Strtod(vector, 23)";
                                                                uVar5 = 0x44e7d2a320dd7455;
                                                                uVar2 = 0x71;
                                                              }
                                                              else {
                                                                buffer_41._8_8_ = 0x23;
                                                                buffer_41.start_ = (char *)0x1;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc3eabd,buffer_41,in_ECX);
                                                  if ((dVar4 != 9e+35) || (NAN(dVar4))) {
                                                    pcVar1 = "9e35";
                                                    pcVar3 = "Strtod(vector, 35)";
                                                    uVar5 = 0x4765aaada1203732;
                                                    uVar2 = 0x72;
                                                  }
                                                  else {
                                                    buffer_42._8_8_ = 0x24;
                                                    buffer_42.start_ = (char *)0x1;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3eabd
                                                                       ,buffer_42,in_ECX);
                                                    if ((dVar4 != 9e+36) || (NAN(dVar4))) {
                                                      pcVar1 = "9e36";
                                                      pcVar3 = "Strtod(vector, 36)";
                                                      uVar5 = 0x479b1559096844ff;
                                                      uVar2 = 0x73;
                                                    }
                                                    else {
                                                      buffer_43._8_8_ = 0x25;
                                                      buffer_43.start_ = (char *)0x1;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3eabd,buffer_43,in_ECX);
                                                      if ((dVar4 != 9e+37) || (NAN(dVar4))) {
                                                        pcVar1 = "9e37";
                                                        pcVar3 = "Strtod(vector, 37)";
                                                        uVar5 = 0x47d0ed57a5e12b1f;
                                                        uVar2 = 0x74;
                                                      }
                                                      else {
                                                        buffer_44._8_8_ = 0xffffffff;
                                                        buffer_44.start_ = (char *)0x1;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3eabd,buffer_44,in_ECX
                                                                          );
                                                        if ((dVar4 != 0.9) || (NAN(dVar4))) {
                                                          pcVar1 = "9e-1";
                                                          pcVar3 = "Strtod(vector, -1)";
                                                          uVar5 = 0x3feccccccccccccd;
                                                          uVar2 = 0x75;
                                                        }
                                                        else {
                                                          buffer_45._8_8_ = 0xfffffffe;
                                                          buffer_45.start_ = (char *)0x1;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3eabd,buffer_45,
                                                                             in_ECX);
                                                          if ((dVar4 != 0.09) || (NAN(dVar4))) {
                                                            pcVar1 = "9e-2";
                                                            pcVar3 = "Strtod(vector, -2)";
                                                            uVar5 = 0x3fb70a3d70a3d70a;
                                                            uVar2 = 0x76;
                                                          }
                                                          else {
                                                            buffer_46._8_8_ = 0xfffffffb;
                                                            buffer_46.start_ = (char *)0x1;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc3eabd,buffer_46,
                                                                               in_ECX);
                                                            if ((dVar4 != 9e-05) || (NAN(dVar4))) {
                                                              pcVar1 = "9e-5";
                                                              pcVar3 = "Strtod(vector, -5)";
                                                              uVar5 = 0x3f1797cc39ffd60f;
                                                              uVar2 = 0x77;
                                                            }
                                                            else {
                                                              buffer_47._8_8_ = 0xffffffec;
                                                              buffer_47.start_ = (char *)0x1;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc3eabd,
                                                                                 buffer_47,in_ECX);
                                                              if ((dVar4 != 9e-20) || (NAN(dVar4)))
                                                              {
                                                                pcVar1 = "9e-20";
                                                                pcVar3 = "Strtod(vector, -20)";
                                                                uVar5 = 0x3bfa90352e248a68;
                                                                uVar2 = 0x78;
                                                              }
                                                              else {
                                                                buffer_48._8_8_ = 0xffffffea;
                                                                buffer_48.start_ = (char *)0x1;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc3eabd,buffer_48,in_ECX);
                                                  if ((dVar4 != 9e-22) || (NAN(dVar4))) {
                                                    pcVar1 = "9e-22";
                                                    pcVar3 = "Strtod(vector, -22)";
                                                    uVar5 = 0x3b910022090d2561;
                                                    uVar2 = 0x79;
                                                  }
                                                  else {
                                                    buffer_49._8_8_ = 0xffffffe9;
                                                    buffer_49.start_ = (char *)0x1;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3eabd
                                                                       ,buffer_49,in_ECX);
                                                    if ((dVar4 != 9e-23) || (NAN(dVar4))) {
                                                      pcVar1 = "9e-23";
                                                      pcVar3 = "Strtod(vector, -23)";
                                                      uVar5 = 0x3b5b3369a815089b;
                                                      uVar2 = 0x7a;
                                                    }
                                                    else {
                                                      buffer_50._8_8_ = 0xffffffe7;
                                                      buffer_50.start_ = (char *)0x1;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3eabd,buffer_50,in_ECX);
                                                      if ((dVar4 != 9e-25) || (NAN(dVar4))) {
                                                        pcVar1 = "9e-25";
                                                        pcVar3 = "Strtod(vector, -25)";
                                                        uVar5 = 0x3af168958a4ae6ca;
                                                        uVar2 = 0x7b;
                                                      }
                                                      else {
                                                        buffer_51._8_8_ = 0xffffffd9;
                                                        buffer_51.start_ = (char *)0x1;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3eabd,buffer_51,in_ECX
                                                                          );
                                                        if ((dVar4 != 9e-39) || (NAN(dVar4))) {
                                                          pcVar1 = "9e-39";
                                                          pcVar3 = "Strtod(vector, -39)";
                                                          uVar5 = 0x38088015a77fd334;
                                                          uVar2 = 0x7c;
                                                        }
                                                        else {
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc46155,(
                                                  Vector<const_char>)ZEXT816(5),in_ECX);
                                                  if ((dVar4 != 12345.0) || (NAN(dVar4))) {
                                                    pcVar1 = "12345.0";
                                                    pcVar3 = "Strtod(vector, 0)";
                                                    uVar5 = 0x40c81c8000000000;
                                                    uVar2 = 0x7f;
                                                  }
                                                  else {
                                                    buffer_52._8_8_ = 1;
                                                    buffer_52.start_ = (char *)0x5;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc46155
                                                                       ,buffer_52,in_ECX);
                                                    if ((dVar4 != 123450.0) || (NAN(dVar4))) {
                                                      pcVar1 = "123450.0";
                                                      pcVar3 = "Strtod(vector, 1)";
                                                      uVar5 = 0x40fe23a000000000;
                                                      uVar2 = 0x80;
                                                    }
                                                    else {
                                                      buffer_53._8_8_ = 2;
                                                      buffer_53.start_ = (char *)0x5;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc46155,buffer_53,in_ECX);
                                                      if ((dVar4 != 1234500.0) || (NAN(dVar4))) {
                                                        pcVar1 = "1234500.0";
                                                        pcVar3 = "Strtod(vector, 2)";
                                                        uVar5 = 0x4132d64400000000;
                                                        uVar2 = 0x81;
                                                      }
                                                      else {
                                                        buffer_54._8_8_ = 0x14;
                                                        buffer_54.start_ = (char *)0x5;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc46155,buffer_54,in_ECX
                                                                          );
                                                        if ((dVar4 != 1.2345e+24) || (NAN(dVar4))) {
                                                          pcVar1 = "12345e20";
                                                          pcVar3 = "Strtod(vector, 20)";
                                                          uVar5 = 0x44f056a610c7aae1;
                                                          uVar2 = 0x82;
                                                        }
                                                        else {
                                                          buffer_55._8_8_ = 0x16;
                                                          buffer_55.start_ = (char *)0x5;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc46155,buffer_55,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.2345e+26) || (NAN(dVar4)))
                                                          {
                                                            pcVar1 = "12345e22";
                                                            pcVar3 = "Strtod(vector, 22)";
                                                            uVar5 = 0x455987637a37faff;
                                                            uVar2 = 0x83;
                                                          }
                                                          else {
                                                            buffer_56._8_8_ = 0x17;
                                                            buffer_56.start_ = (char *)0x5;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc46155,buffer_56,
                                                                               in_ECX);
                                                            if ((dVar4 != 1.2345e+27) ||
                                                               (NAN(dVar4))) {
                                                              pcVar1 = "12345e23";
                                                              pcVar3 = "Strtod(vector, 23)";
                                                              uVar5 = 0x458fe93c58c5f9bf;
                                                              uVar2 = 0x84;
                                                            }
                                                            else {
                                                              buffer_57._8_8_ = 0x1e;
                                                              buffer_57.start_ = (char *)0x5;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc46155,
                                                                                 buffer_57,in_ECX);
                                                              if ((dVar4 != 1.2345e+34) ||
                                                                 (NAN(dVar4))) {
                                                                pcVar1 = "12345e30";
                                                                pcVar3 = "Strtod(vector, 30)";
                                                                uVar5 = 0x4703053e72afbcad;
                                                                uVar2 = 0x85;
                                                              }
                                                              else {
                                                                buffer_58._8_8_ = 0x1f;
                                                                buffer_58.start_ = (char *)0x5;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc46155,buffer_58,in_ECX);
                                                  if ((dVar4 != 1.2345e+35) || (NAN(dVar4))) {
                                                    pcVar1 = "12345e31";
                                                    pcVar3 = "Strtod(vector, 31)";
                                                    uVar5 = 0x4737c68e0f5babd8;
                                                    uVar2 = 0x86;
                                                  }
                                                  else {
                                                    buffer_59._8_8_ = 0x20;
                                                    buffer_59.start_ = (char *)0x5;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc46155
                                                                       ,buffer_59,in_ECX);
                                                    if ((dVar4 != 1.2345e+36) || (NAN(dVar4))) {
                                                      pcVar1 = "12345e32";
                                                      pcVar3 = "Strtod(vector, 32)";
                                                      uVar5 = 0x476db831933296ce;
                                                      uVar2 = 0x87;
                                                    }
                                                    else {
                                                      buffer_60._8_8_ = 0x23;
                                                      buffer_60.start_ = (char *)0x5;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc46155,buffer_60,in_ECX);
                                                      if ((dVar4 != 1.2345e+39) || (NAN(dVar4))) {
                                                        pcVar1 = "12345e35";
                                                        pcVar3 = "Strtod(vector, 35)";
                                                        uVar5 = 0x480d05e069bf6745;
                                                        uVar2 = 0x88;
                                                      }
                                                      else {
                                                        buffer_61._8_8_ = 0x24;
                                                        buffer_61.start_ = (char *)0x5;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc46155,buffer_61,in_ECX
                                                                          );
                                                        if ((dVar4 != 1.2345e+40) || (NAN(dVar4))) {
                                                          pcVar1 = "12345e36";
                                                          pcVar3 = "Strtod(vector, 36)";
                                                          uVar5 = 0x484223ac4217a08b;
                                                          uVar2 = 0x89;
                                                        }
                                                        else {
                                                          buffer_62._8_8_ = 0x25;
                                                          buffer_62.start_ = (char *)0x5;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc46155,buffer_62,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.2345e+41) || (NAN(dVar4)))
                                                          {
                                                            pcVar1 = "12345e37";
                                                            pcVar3 = "Strtod(vector, 37)";
                                                            uVar5 = 0x4876ac97529d88ae;
                                                            uVar2 = 0x8a;
                                                          }
                                                          else {
                                                            buffer_63._8_8_ = 0xffffffff;
                                                            buffer_63.start_ = (char *)0x5;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc46155,buffer_63,
                                                                               in_ECX);
                                                            if ((dVar4 != 1234.5) || (NAN(dVar4))) {
                                                              pcVar1 = "12345e-1";
                                                              pcVar3 = "Strtod(vector, -1)";
                                                              uVar5 = 0x40934a0000000000;
                                                              uVar2 = 0x8b;
                                                            }
                                                            else {
                                                              buffer_64._8_8_ = 0xfffffffe;
                                                              buffer_64.start_ = (char *)0x5;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc46155,
                                                                                 buffer_64,in_ECX);
                                                              if ((dVar4 != 123.45) || (NAN(dVar4)))
                                                              {
                                                                pcVar1 = "12345e-2";
                                                                pcVar3 = "Strtod(vector, -2)";
                                                                uVar5 = 0x405edccccccccccd;
                                                                uVar2 = 0x8c;
                                                              }
                                                              else {
                                                                buffer_65._8_8_ = 0xfffffffb;
                                                                buffer_65.start_ = (char *)0x5;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc46155,buffer_65,in_ECX);
                                                  if ((dVar4 != 0.12345) || (NAN(dVar4))) {
                                                    pcVar1 = "12345e-5";
                                                    pcVar3 = "Strtod(vector, -5)";
                                                    uVar5 = 0x3fbf9a6b50b0f27c;
                                                    uVar2 = 0x8d;
                                                  }
                                                  else {
                                                    buffer_66._8_8_ = 0xffffffec;
                                                    buffer_66.start_ = (char *)0x5;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc46155
                                                                       ,buffer_66,in_ECX);
                                                    if ((dVar4 != 1.2345e-16) || (NAN(dVar4))) {
                                                      pcVar1 = "12345e-20";
                                                      pcVar3 = "Strtod(vector, -20)";
                                                      uVar5 = 0x3ca1ca8048dce3dd;
                                                      uVar2 = 0x8e;
                                                    }
                                                    else {
                                                      buffer_67._8_8_ = 0xffffffea;
                                                      buffer_67.start_ = (char *)0x5;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc46155,buffer_67,in_ECX);
                                                      if ((dVar4 != 1.2345e-18) || (NAN(dVar4))) {
                                                        pcVar1 = "12345e-22";
                                                        pcVar3 = "Strtod(vector, -22)";
                                                        uVar5 = 0x3c36c5c2ec9fdbfd;
                                                        uVar2 = 0x8f;
                                                      }
                                                      else {
                                                        buffer_68._8_8_ = 0xffffffe9;
                                                        buffer_68.start_ = (char *)0x5;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc46155,buffer_68,in_ECX
                                                                          );
                                                        if ((dVar4 != 1.2345e-19) || (NAN(dVar4))) {
                                                          pcVar1 = "12345e-23";
                                                          pcVar3 = "Strtod(vector, -23)";
                                                          uVar5 = 0x3c0237cf23b31664;
                                                          uVar2 = 0x90;
                                                        }
                                                        else {
                                                          buffer_69._8_8_ = 0xffffffe7;
                                                          buffer_69.start_ = (char *)0x5;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc46155,buffer_69,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.2345e-21) || (NAN(dVar4)))
                                                          {
                                                            pcVar1 = "12345e-25";
                                                            pcVar3 = "Strtod(vector, -25)";
                                                            uVar5 = 0x3b9751acfa7ed4fb;
                                                            uVar2 = 0x91;
                                                          }
                                                          else {
                                                            buffer_70._8_8_ = 0xffffffd9;
                                                            buffer_70.start_ = (char *)0x5;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc46155,buffer_70,
                                                                               in_ECX);
                                                            if ((dVar4 != 1.2345e-35) ||
                                                               (NAN(dVar4))) {
                                                              pcVar1 = "12345e-39";
                                                              pcVar3 = "Strtod(vector, -39)";
                                                              uVar5 = 0x38b068c92b79d1ff;
                                                              uVar2 = 0x92;
                                                            }
                                                            else {
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc3c648,
                                                                                 (Vector<const_char>
                                                                                 )ZEXT816(0xe),
                                                                                 in_ECX);
                                                              if ((dVar4 != 12345678901234.0) ||
                                                                 (NAN(dVar4))) {
                                                                pcVar1 = "12345678901234.0";
                                                                pcVar3 = "Strtod(vector, 0)";
                                                                uVar5 = 0x42a674e79c5fe400;
                                                                uVar2 = 0x95;
                                                              }
                                                              else {
                                                                buffer_71._8_8_ = 1;
                                                                buffer_71.start_ = (char *)0xe;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc3c648,buffer_71,in_ECX);
                                                  if ((dVar4 != 123456789012340.0) || (NAN(dVar4)))
                                                  {
                                                    pcVar1 = "123456789012340.0";
                                                    pcVar3 = "Strtod(vector, 1)";
                                                    uVar5 = 0x42dc12218377dd00;
                                                    uVar2 = 0x96;
                                                  }
                                                  else {
                                                    buffer_72._8_8_ = 2;
                                                    buffer_72.start_ = (char *)0xe;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3c648
                                                                       ,buffer_72,in_ECX);
                                                    if ((dVar4 != 1.2345678901234e+15) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123400.0";
                                                      pcVar3 = "Strtod(vector, 2)";
                                                      uVar5 = 0x43118b54f22aea20;
                                                      uVar2 = 0x97;
                                                    }
                                                    else {
                                                      buffer_73._8_8_ = 0x14;
                                                      buffer_73.start_ = (char *)0xe;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3c648,buffer_73,in_ECX);
                                                      if ((dVar4 != 1.2345678901234e+33) ||
                                                         (NAN(dVar4))) {
                                                        pcVar1 = "12345678901234e20";
                                                        pcVar3 = "Strtod(vector, 20)";
                                                        uVar5 = 0x46ce6f37ffcb97e5;
                                                        uVar2 = 0x98;
                                                      }
                                                      else {
                                                        buffer_74._8_8_ = 0x16;
                                                        buffer_74.start_ = (char *)0xe;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3c648,buffer_74,in_ECX
                                                                          );
                                                        if ((dVar4 != 1.2345678901234e+35) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "12345678901234e22";
                                                          pcVar3 = "Strtod(vector, 22)";
                                                          uVar5 = 0x4737c6e3bfd70eab;
                                                          uVar2 = 0x99;
                                                        }
                                                        else {
                                                          buffer_75._8_8_ = 0x17;
                                                          buffer_75.start_ = (char *)0xe;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3c648,buffer_75,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.2345678901234e+36) ||
                                                             (NAN(dVar4))) {
                                                            pcVar1 = "12345678901234e23";
                                                            pcVar3 = "Strtod(vector, 23)";
                                                            uVar5 = 0x476db89cafccd256;
                                                            uVar2 = 0x9a;
                                                          }
                                                          else {
                                                            buffer_76._8_8_ = 0x1e;
                                                            buffer_76.start_ = (char *)0xe;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc3c648,buffer_76,
                                                                               in_ECX);
                                                            if ((dVar4 != 1.2345678901234e+43) ||
                                                               (NAN(dVar4))) {
                                                              pcVar1 = "12345678901234e30";
                                                              pcVar3 = "Strtod(vector, 30)";
                                                              uVar5 = 0x48e1b716107ef6cd;
                                                              uVar2 = 0x9b;
                                                            }
                                                            else {
                                                              buffer_77._8_8_ = 0x1f;
                                                              buffer_77.start_ = (char *)0xe;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc3c648,
                                                                                 buffer_77,in_ECX);
                                                              if ((dVar4 != 1.2345678901234e+44) ||
                                                                 (NAN(dVar4))) {
                                                                pcVar1 = "12345678901234e31";
                                                                pcVar3 = "Strtod(vector, 31)";
                                                                uVar5 = 0x491624db949eb480;
                                                                uVar2 = 0x9c;
                                                              }
                                                              else {
                                                                buffer_78._8_8_ = 0x20;
                                                                buffer_78.start_ = (char *)0xe;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc3c648,buffer_78,in_ECX);
                                                  if ((dVar4 != 1.2345678901234e+45) || (NAN(dVar4))
                                                     ) {
                                                    pcVar1 = "12345678901234e32";
                                                    pcVar3 = "Strtod(vector, 32)";
                                                    uVar5 = 0x494bae1279c661a0;
                                                    uVar2 = 0x9d;
                                                  }
                                                  else {
                                                    buffer_79._8_8_ = 0x23;
                                                    buffer_79.start_ = (char *)0xe;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3c648
                                                                       ,buffer_79,in_ECX);
                                                    if ((dVar4 != 1.2345678901234e+48) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "12345678901234e35";
                                                      pcVar3 = "Strtod(vector, 35)";
                                                      uVar5 = 0x49eb07fe0aebbb56;
                                                      uVar2 = 0x9e;
                                                    }
                                                    else {
                                                      buffer_80._8_8_ = 0x24;
                                                      buffer_80.start_ = (char *)0xe;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3c648,buffer_80,in_ECX);
                                                      if ((dVar4 != 1.2345678901234e+49) ||
                                                         (NAN(dVar4))) {
                                                        pcVar1 = "12345678901234e36";
                                                        pcVar3 = "Strtod(vector, 36)";
                                                        uVar5 = 0x4a20e4fec6d35516;
                                                        uVar2 = 0x9f;
                                                      }
                                                      else {
                                                        buffer_81._8_8_ = 0x25;
                                                        buffer_81.start_ = (char *)0xe;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3c648,buffer_81,in_ECX
                                                                          );
                                                        if ((dVar4 != 1.2345678901234e+50) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "12345678901234e37";
                                                          pcVar3 = "Strtod(vector, 37)";
                                                          uVar5 = 0x4a551e3e78882a5b;
                                                          uVar2 = 0xa0;
                                                        }
                                                        else {
                                                          buffer_82._8_8_ = 0xffffffff;
                                                          buffer_82.start_ = (char *)0xe;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3c648,buffer_82,
                                                                             in_ECX);
                                                          if ((dVar4 != 1234567890123.4) ||
                                                             (NAN(dVar4))) {
                                                            pcVar1 = "12345678901234e-1";
                                                            pcVar3 = "Strtod(vector, -1)";
                                                            uVar5 = 0x4271f71fb04cb666;
                                                            uVar2 = 0xa1;
                                                          }
                                                          else {
                                                            buffer_83._8_8_ = 0xfffffffe;
                                                            buffer_83.start_ = (char *)0xe;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc3c648,buffer_83,
                                                                               in_ECX);
                                                            if ((dVar4 != 123456789012.34) ||
                                                               (NAN(dVar4))) {
                                                              pcVar1 = "12345678901234e-2";
                                                              pcVar3 = "Strtod(vector, -2)";
                                                              uVar5 = 0x423cbe991a14570a;
                                                              uVar2 = 0xa2;
                                                            }
                                                            else {
                                                              buffer_84._8_8_ = 0xfffffffb;
                                                              buffer_84.start_ = (char *)0xe;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc3c648,
                                                                                 buffer_84,in_ECX);
                                                              if ((dVar4 != 123456789.01234) ||
                                                                 (NAN(dVar4))) {
                                                                pcVar1 = "12345678901234e-5";
                                                                pcVar3 = "Strtod(vector, -5)";
                                                                uVar5 = 0x419d6f34540ca2db;
                                                                uVar2 = 0xa3;
                                                              }
                                                              else {
                                                                buffer_85._8_8_ = 0xffffffec;
                                                                buffer_85.start_ = (char *)0xe;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc3c648,buffer_85,in_ECX);
                                                  if ((dVar4 != 1.2345678901234e-07) || (NAN(dVar4))
                                                     ) {
                                                    pcVar1 = "12345678901234e-20";
                                                    pcVar3 = "Strtod(vector, -20)";
                                                    uVar5 = 0x3e8091f1667f04bf;
                                                    uVar2 = 0xa4;
                                                  }
                                                  else {
                                                    buffer_86._8_8_ = 0xffffffea;
                                                    buffer_86.start_ = (char *)0xe;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3c648
                                                                       ,buffer_86,in_ECX);
                                                    if ((dVar4 != 1.2345678901234e-09) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "12345678901234e-22";
                                                      pcVar3 = "Strtod(vector, -22)";
                                                      uVar5 = 0x3e1535afdf5ae75b;
                                                      uVar2 = 0xa5;
                                                    }
                                                    else {
                                                      buffer_87._8_8_ = 0xffffffe9;
                                                      buffer_87.start_ = (char *)0xe;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3c648,buffer_87,in_ECX);
                                                      if ((dVar4 != 1.2345678901234e-10) ||
                                                         (NAN(dVar4))) {
                                                        pcVar1 = "12345678901234e-23";
                                                        pcVar3 = "Strtod(vector, -23)";
                                                        uVar5 = 0x3de0f7bfe5e252af;
                                                        uVar2 = 0xa6;
                                                      }
                                                      else {
                                                        buffer_88._8_8_ = 0xffffffe7;
                                                        buffer_88.start_ = (char *)0xe;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3c648,buffer_88,in_ECX
                                                                          );
                                                        if ((dVar4 != 1.2345678901234e-12) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "12345678901234e-25";
                                                          pcVar3 = "Strtod(vector, -25)";
                                                          uVar5 = 0x3d75b7ffde92555b;
                                                          uVar2 = 0xa7;
                                                        }
                                                        else {
                                                          buffer_89._8_8_ = 0xffffffd9;
                                                          buffer_89.start_ = (char *)0xe;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3c648,buffer_89,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.2345678901234e-26) ||
                                                             (NAN(dVar4))) {
                                                            pcVar1 = "12345678901234e-39";
                                                            pcVar3 = "Strtod(vector, -39)";
                                                            uVar5 = 0x3a8e9100ee33ee5f;
                                                            uVar2 = 0xa8;
                                                          }
                                                          else {
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc4614b,(
                                                  Vector<const_char>)ZEXT816(0xf),in_ECX);
                                                  if ((dVar4 != 123456789012345.0) || (NAN(dVar4)))
                                                  {
                                                    pcVar1 = "123456789012345.0";
                                                    pcVar3 = "Strtod(vector, 0)";
                                                    uVar5 = 0x42dc12218377de40;
                                                    uVar2 = 0xab;
                                                  }
                                                  else {
                                                    buffer_90._8_8_ = 1;
                                                    buffer_90.start_ = (char *)0xf;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc4614b
                                                                       ,buffer_90,in_ECX);
                                                    if ((dVar4 != 1.23456789012345e+15) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123450.0";
                                                      pcVar3 = "Strtod(vector, 1)";
                                                      uVar5 = 0x43118b54f22aeae8;
                                                      uVar2 = 0xac;
                                                    }
                                                    else {
                                                      buffer_91._8_8_ = 2;
                                                      buffer_91.start_ = (char *)0xf;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc4614b,buffer_91,in_ECX);
                                                      if ((dVar4 != 1.23456789012345e+16) ||
                                                         (NAN(dVar4))) {
                                                        pcVar1 = "12345678901234500.0";
                                                        pcVar3 = "Strtod(vector, 2)";
                                                        uVar5 = 0x4345ee2a2eb5a5a2;
                                                        uVar2 = 0xad;
                                                      }
                                                      else {
                                                        buffer_92._8_8_ = 0x14;
                                                        buffer_92.start_ = (char *)0xf;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc4614b,buffer_92,in_ECX
                                                                          );
                                                        if ((dVar4 != 1.23456789012345e+34) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "123456789012345e20";
                                                          pcVar3 = "Strtod(vector, 20)";
                                                          uVar5 = 0x47030582ffdf3fc8;
                                                          uVar2 = 0xae;
                                                        }
                                                        else {
                                                          buffer_93._8_8_ = 0x16;
                                                          buffer_93.start_ = (char *)0xf;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc4614b,buffer_93,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.23456789012345e+36) ||
                                                             (NAN(dVar4))) {
                                                            pcVar1 = "123456789012345e22";
                                                            pcVar3 = "Strtod(vector, 22)";
                                                            uVar5 = 0x476db89cafccd3a9;
                                                            uVar2 = 0xaf;
                                                          }
                                                          else {
                                                            buffer_94._8_8_ = 0x17;
                                                            buffer_94.start_ = (char *)0xf;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc4614b,buffer_94,
                                                                               in_ECX);
                                                            if ((dVar4 != 1.23456789012345e+37) ||
                                                               (NAN(dVar4))) {
                                                              pcVar1 = "123456789012345e23";
                                                              pcVar3 = "Strtod(vector, 23)";
                                                              uVar5 = 0x47a29361ede00449;
                                                              uVar2 = 0xb0;
                                                            }
                                                            else {
                                                              buffer_95._8_8_ = 0x23;
                                                              buffer_95.start_ = (char *)0xf;
                                                              dVar4 = double_conversion::Strtod
                                                                                ((double_conversion
                                                                                  *)0xc4614b,
                                                                                 buffer_95,in_ECX);
                                                              if ((dVar4 != 1.23456789012345e+49) ||
                                                                 (NAN(dVar4))) {
                                                                pcVar1 = "123456789012345e35";
                                                                pcVar3 = "Strtod(vector, 35)";
                                                                uVar5 = 0x4a20e4fec6d355d6;
                                                                uVar2 = 0xb1;
                                                              }
                                                              else {
                                                                buffer_96._8_8_ = 0x24;
                                                                buffer_96.start_ = (char *)0xf;
                                                                dVar4 = double_conversion::Strtod
                                                                                  ((
                                                  double_conversion *)0xc4614b,buffer_96,in_ECX);
                                                  if ((dVar4 != 1.23456789012345e+50) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = "123456789012345e36";
                                                    pcVar3 = "Strtod(vector, 36)";
                                                    uVar5 = 0x4a551e3e78882b4c;
                                                    uVar2 = 0xb2;
                                                  }
                                                  else {
                                                    buffer_97._8_8_ = 0x25;
                                                    buffer_97.start_ = (char *)0xf;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc4614b
                                                                       ,buffer_97,in_ECX);
                                                    if ((dVar4 != 1.23456789012345e+51) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "123456789012345e37";
                                                      pcVar3 = "Strtod(vector, 37)";
                                                      uVar5 = 0x4a8a65ce16aa361f;
                                                      uVar2 = 0xb3;
                                                    }
                                                    else {
                                                      buffer_98._8_8_ = 0x27;
                                                      buffer_98.start_ = (char *)0xf;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc4614b,buffer_98,in_ECX);
                                                      if ((dVar4 != 1.23456789012345e+53) ||
                                                         (NAN(dVar4))) {
                                                        pcVar1 = "123456789012345e39";
                                                        pcVar3 = "Strtod(vector, 39)";
                                                        uVar5 = 0x4af49f8901b4fa48;
                                                        uVar2 = 0xb4;
                                                      }
                                                      else {
                                                        buffer_99._8_8_ = 0xffffffff;
                                                        buffer_99.start_ = (char *)0xf;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc4614b,buffer_99,in_ECX
                                                                          );
                                                        if ((dVar4 != 12345678901234.5) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "123456789012345e-1";
                                                          pcVar3 = "Strtod(vector, -1)";
                                                          uVar5 = 0x42a674e79c5fe500;
                                                          uVar2 = 0xb5;
                                                        }
                                                        else {
                                                          buffer_x00100._8_8_ = 0xfffffffe;
                                                          buffer_x00100.start_ = (char *)0xf;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc4614b,buffer_x00100,
                                                                             in_ECX);
                                                          if ((dVar4 != 1234567890123.45) ||
                                                             (NAN(dVar4))) {
                                                            pcVar1 = "123456789012345e-2";
                                                            pcVar3 = "Strtod(vector, -2)";
                                                            uVar5 = 0x4271f71fb04cb733;
                                                            uVar2 = 0xb6;
                                                          }
                                                          else {
                                                            buffer_x00101._8_8_ = 0xfffffffb;
                                                            buffer_x00101.start_ = (char *)0xf;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc4614b,
                                                  buffer_x00101,in_ECX);
                                                  if ((dVar4 != 1234567890.12345) || (NAN(dVar4))) {
                                                    pcVar1 = "123456789012345e-5";
                                                    pcVar3 = "Strtod(vector, -5)";
                                                    uVar5 = 0x41d26580b487e69b;
                                                    uVar2 = 0xb7;
                                                  }
                                                  else {
                                                    buffer_x00102._8_8_ = 0xffffffec;
                                                    buffer_x00102.start_ = (char *)0xf;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc4614b
                                                                       ,buffer_x00102,in_ECX);
                                                    if ((dVar4 != 1.23456789012345e-06) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "123456789012345e-20";
                                                      pcVar3 = "Strtod(vector, -20)";
                                                      uVar5 = 0x3eb4b66dc01ec6db;
                                                      uVar2 = 0xb8;
                                                    }
                                                    else {
                                                      buffer_x00103._8_8_ = 0xffffffea;
                                                      buffer_x00103.start_ = (char *)0xf;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc4614b,buffer_x00103,
                                                                         in_ECX);
                                                      if ((dVar4 != 1.23456789012345e-08) ||
                                                         (NAN(dVar4))) {
                                                        pcVar1 = "123456789012345e-22";
                                                        pcVar3 = "Strtod(vector, -22)";
                                                        uVar5 = 0x3e4a831bd731a260;
                                                        uVar2 = 0xb9;
                                                      }
                                                      else {
                                                        buffer_x00104._8_8_ = 0xffffffe9;
                                                        buffer_x00104.start_ = (char *)0xf;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc4614b,buffer_x00104,
                                                                           in_ECX);
                                                        if ((dVar4 != 1.23456789012345e-09) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "123456789012345e-23";
                                                          pcVar3 = "Strtod(vector, -23)";
                                                          uVar5 = 0x3e1535afdf5ae84d;
                                                          uVar2 = 0xba;
                                                        }
                                                        else {
                                                          buffer_x00105._8_8_ = 0xffffffe7;
                                                          buffer_x00105.start_ = (char *)0xf;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc4614b,buffer_x00105,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.23456789012345e-11) ||
                                                             (NAN(dVar4))) {
                                                            pcVar1 = "123456789012345e-25";
                                                            pcVar3 = "Strtod(vector, -25)";
                                                            uVar5 = 0x3dab25ffd636ebe8;
                                                            uVar2 = 0xbb;
                                                          }
                                                          else {
                                                            buffer_x00106._8_8_ = 0xffffffd9;
                                                            buffer_x00106.start_ = (char *)0xf;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc4614b,
                                                  buffer_x00106,in_ECX);
                                                  if ((dVar4 != 1.23456789012345e-25) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = "123456789012345e-39";
                                                    pcVar3 = "Strtod(vector, -39)";
                                                    uVar5 = 0x3ac31aa094e075d5;
                                                    uVar2 = 0xbc;
                                                  }
                                                  else {
                                                    buffer_x00107._8_8_ = 0x3039;
                                                    buffer_x00107.start_ = (char *)0x1;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3ed66
                                                                       ,buffer_x00107,in_ECX);
                                                    uVar5 = 0;
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = "StrtodChar(\"0\", 12345)";
                                                      uVar2 = 0xbe;
                                                    }
                                                    else {
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0x87e019,(
                                                  Vector<const_char>)(ZEXT816(0x52c) << 0x40),in_ECX
                                                  );
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = "StrtodChar(\"\", 1324)";
                                                    uVar5 = 0;
                                                    uVar2 = 0xbf;
                                                  }
                                                  else {
                                                    buffer_x00108._8_8_ = 0x7b;
                                                    buffer_x00108.start_ = (char *)0x9;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3a116
                                                                       ,buffer_x00108,in_ECX);
                                                    uVar5 = 0;
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = "StrtodChar(\"000000000\", 123)";
                                                      uVar2 = 0xc0;
                                                    }
                                                    else {
                                                      buffer_x00109._8_8_ = 0xfffffebc;
                                                      buffer_x00109.start_ = (char *)0x1;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3f93b,buffer_x00109,
                                                                         in_ECX);
                                                      if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                        pcVar1 = "0.0";
                                                        pcVar3 = "StrtodChar(\"2\", -324)";
                                                        uVar5 = 0;
                                                        uVar2 = 0xc1;
                                                      }
                                                      else {
                                                        buffer_x00110._8_8_ = 0xfffffebc;
                                                        buffer_x00110.start_ = (char *)0x1;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3c001,buffer_x00110,
                                                                           in_ECX);
                                                        if ((dVar4 != 4.94065645841247e-324) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "4e-324";
                                                          pcVar3 = "StrtodChar(\"3\", -324)";
                                                          uVar5 = 1;
                                                          uVar2 = 0xc2;
                                                        }
                                                        else {
                                                          buffer_x00111._8_8_ = 0xfffffebb;
                                                          buffer_x00111.start_ = (char *)0x1;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3e5f9,buffer_x00111,
                                                                             in_ECX);
                                                          uVar5 = 0;
                                                          if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                            pcVar1 = "0.0";
                                                            pcVar3 = "StrtodChar(\"1\", -325)";
                                                            uVar2 = 0xc6;
                                                          }
                                                          else {
                                                            buffer_x00112._8_8_ = 0xfffffebb;
                                                            buffer_x00112.start_ = (char *)0x1;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc3e5f9,
                                                  buffer_x00112,in_ECX);
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = "StrtodChar(\"1\", -325)";
                                                    uVar5 = 0;
                                                    uVar2 = 199;
                                                  }
                                                  else {
                                                    buffer_x00113._8_8_ = 0xfffffeb8;
                                                    buffer_x00113.start_ = (char *)0x5;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc45a40
                                                                       ,buffer_x00113,in_ECX);
                                                    uVar5 = 0;
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = "StrtodChar(\"20000\", -328)";
                                                      uVar2 = 200;
                                                    }
                                                    else {
                                                      buffer_x00114._8_8_ = 0xfffffeb8;
                                                      buffer_x00114.start_ = (char *)0x5;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc45a6c,buffer_x00114,
                                                                         in_ECX);
                                                      if ((dVar4 != 4.94065645841247e-324) ||
                                                         (NAN(dVar4))) {
                                                        pcVar1 = "40000e-328";
                                                        pcVar3 = "StrtodChar(\"30000\", -328)";
                                                        uVar5 = 1;
                                                        uVar2 = 0xc9;
                                                      }
                                                      else {
                                                        buffer_x00115._8_8_ = 0xfffffeb7;
                                                        buffer_x00115.start_ = (char *)0x5;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc45a9c,buffer_x00115,
                                                                           in_ECX);
                                                        uVar5 = 0;
                                                        if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                          pcVar1 = "0.0";
                                                          pcVar3 = "StrtodChar(\"10000\", -329)";
                                                          uVar2 = 0xca;
                                                        }
                                                        else {
                                                          buffer_x00116._8_8_ = 0xfffffeb7;
                                                          buffer_x00116.start_ = (char *)0x5;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc45acc,buffer_x00116,
                                                                             in_ECX);
                                                          if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                            pcVar1 = "0.0";
                                                            pcVar3 = "StrtodChar(\"90000\", -329)";
                                                            uVar5 = 0;
                                                            uVar2 = 0xcb;
                                                          }
                                                          else {
                                                            buffer_x00117._8_8_ = 0xfffffebb;
                                                            buffer_x00117.start_ = (char *)0x9;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc30aaa,
                                                  buffer_x00117,in_ECX);
                                                  uVar5 = 0;
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = "StrtodChar(\"000000001\", -325)";
                                                    uVar2 = 0xcc;
                                                  }
                                                  else {
                                                    buffer_x00118._8_8_ = 0xfffffebb;
                                                    buffer_x00118.start_ = (char *)0x9;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc30aaa
                                                                       ,buffer_x00118,in_ECX);
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = "StrtodChar(\"000000001\", -325)";
                                                      uVar5 = 0;
                                                      uVar2 = 0xcd;
                                                    }
                                                    else {
                                                      buffer_x00119._8_8_ = 0xfffffeb8;
                                                      buffer_x00119.start_ = (char *)0xd;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         "0000000020000",
                                                                         buffer_x00119,in_ECX);
                                                      uVar5 = 0;
                                                      if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                        pcVar1 = "0.0";
                                                        pcVar3 = 
                                                  "StrtodChar(\"0000000020000\", -328)";
                                                  uVar2 = 0xce;
                                                  }
                                                  else {
                                                    buffer_x00120._8_8_ = 0xfffffeb8;
                                                    buffer_x00120.start_ = (char *)0xb;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "00000030000",buffer_x00120,
                                                                       in_ECX);
                                                    if ((dVar4 != 4.94065645841247e-324) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "40000e-328";
                                                      pcVar3 = "StrtodChar(\"00000030000\", -328)";
                                                      uVar5 = 1;
                                                      uVar2 = 0xcf;
                                                    }
                                                    else {
                                                      buffer_x00121._8_8_ = 0xfffffeb7;
                                                      buffer_x00121.start_ = (char *)0xd;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         "0000000010000",
                                                                         buffer_x00121,in_ECX);
                                                      uVar5 = 0;
                                                      if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                        pcVar1 = "0.0";
                                                        pcVar3 = 
                                                  "StrtodChar(\"0000000010000\", -329)";
                                                  uVar2 = 0xd0;
                                                  }
                                                  else {
                                                    buffer_x00122._8_8_ = 0xfffffeb7;
                                                    buffer_x00122.start_ = (char *)0xd;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "0000000090000",buffer_x00122
                                                                       ,in_ECX);
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = "StrtodChar(\"0000000090000\", -329)"
                                                      ;
                                                      uVar5 = 0;
                                                      uVar2 = 0xd1;
                                                    }
                                                    else {
                                                      buffer_x00123._8_8_ = 0x135;
                                                      buffer_x00123.start_ = (char *)0x1;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3e5f9,buffer_x00123,
                                                                         in_ECX);
                                                      if (dVar4 < INFINITY) {
                                                        pcVar1 = "Double::Infinity()";
                                                        pcVar3 = "StrtodChar(\"1\", 309)";
                                                        uVar5 = 0x7ff0000000000000;
                                                        uVar2 = 0xd6;
                                                      }
                                                      else {
                                                        buffer_x00124._8_8_ = 0x134;
                                                        buffer_x00124.start_ = (char *)0x1;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3e5f9,buffer_x00124,
                                                                           in_ECX);
                                                        if ((dVar4 != 1e+308) || (NAN(dVar4))) {
                                                          pcVar1 = "1e308";
                                                          pcVar3 = "StrtodChar(\"1\", 308)";
                                                          uVar5 = 0x7fe1ccf385ebc8a0;
                                                          uVar2 = 0xd7;
                                                        }
                                                        else {
                                                          buffer_x00125._8_8_ = 0x131;
                                                          buffer_x00125.start_ = (char *)0x4;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc45bf5,buffer_x00125,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.234e+308) || (NAN(dVar4)))
                                                          {
                                                            pcVar1 = "1234e305";
                                                            pcVar3 = "StrtodChar(\"1234\", 305)";
                                                            uVar5 = 0x7fe5f74721acaf61;
                                                            uVar2 = 0xd8;
                                                          }
                                                          else {
                                                            buffer_x00126._8_8_ = 0x130;
                                                            buffer_x00126.start_ = (char *)0x4;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc45bf5,
                                                  buffer_x00126,in_ECX);
                                                  if ((dVar4 != 1.234e+307) || (NAN(dVar4))) {
                                                    pcVar1 = "1234e304";
                                                    pcVar3 = "StrtodChar(\"1234\", 304)";
                                                    uVar5 = 0x7fb1929f4e23bf81;
                                                    uVar2 = 0xd9;
                                                  }
                                                  else {
                                                    buffer_x00127._8_8_ = 0x133;
                                                    buffer_x00127.start_ = (char *)0x2;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc4313f
                                                                       ,buffer_x00127,in_ECX);
                                                    if (dVar4 < INFINITY) {
                                                      pcVar1 = "Double::Infinity()";
                                                      pcVar3 = "StrtodChar(\"18\", 307)";
                                                      uVar5 = 0x7ff0000000000000;
                                                      uVar2 = 0xda;
                                                    }
                                                    else {
                                                      buffer_x00128._8_8_ = 0x133;
                                                      buffer_x00128.start_ = (char *)0x2;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc430f9,buffer_x00128,
                                                                         in_ECX);
                                                      if ((dVar4 != 1.7e+308) || (NAN(dVar4))) {
                                                        pcVar1 = "17e307";
                                                        pcVar3 = "StrtodChar(\"17\", 307)";
                                                        uVar5 = 0x7fee42d130773b76;
                                                        uVar2 = 0xdb;
                                                      }
                                                      else {
                                                        buffer_x00129._8_8_ = 0x135;
                                                        buffer_x00129.start_ = (char *)0x7;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc30aac,buffer_x00129,
                                                                           in_ECX);
                                                        if (dVar4 < INFINITY) {
                                                          pcVar1 = "Double::Infinity()";
                                                          pcVar3 = "StrtodChar(\"0000001\", 309)";
                                                          uVar5 = 0x7ff0000000000000;
                                                          uVar2 = 0xdc;
                                                        }
                                                        else {
                                                          buffer_x00130._8_8_ = 0x134;
                                                          buffer_x00130.start_ = (char *)0x8;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc30aab,buffer_x00130,
                                                                             in_ECX);
                                                          if ((dVar4 != 1e+308) || (NAN(dVar4))) {
                                                            pcVar1 = "1e308";
                                                            pcVar3 = "StrtodChar(\"00000001\", 308)"
                                                            ;
                                                            uVar5 = 0x7fe1ccf385ebc8a0;
                                                            uVar2 = 0xdd;
                                                          }
                                                          else {
                                                            buffer_x00131._8_8_ = 0x131;
                                                            buffer_x00131.start_ = (char *)0xb;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc45bee,
                                                  buffer_x00131,in_ECX);
                                                  if ((dVar4 != 1.234e+308) || (NAN(dVar4))) {
                                                    pcVar1 = "1234e305";
                                                    pcVar3 = "StrtodChar(\"00000001234\", 305)";
                                                    uVar5 = 0x7fe5f74721acaf61;
                                                    uVar2 = 0xde;
                                                  }
                                                  else {
                                                    buffer_x00132._8_8_ = 0x130;
                                                    buffer_x00132.start_ = (char *)0xc;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "000000001234",buffer_x00132,
                                                                       in_ECX);
                                                    if ((dVar4 != 1.234e+307) || (NAN(dVar4))) {
                                                      pcVar1 = "1234e304";
                                                      pcVar3 = "StrtodChar(\"000000001234\", 304)";
                                                      uVar5 = 0x7fb1929f4e23bf81;
                                                      uVar2 = 0xdf;
                                                    }
                                                    else {
                                                      buffer_x00133._8_8_ = 0x133;
                                                      buffer_x00133.start_ = (char *)0xa;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         "0000000018",buffer_x00133,
                                                                         in_ECX);
                                                      if (dVar4 < INFINITY) {
                                                        pcVar1 = "Double::Infinity()";
                                                        pcVar3 = "StrtodChar(\"0000000018\", 307)";
                                                        uVar5 = 0x7ff0000000000000;
                                                        uVar2 = 0xe0;
                                                      }
                                                      else {
                                                        buffer_x00134._8_8_ = 0x133;
                                                        buffer_x00134.start_ = (char *)0xa;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           "0000000017",
                                                                           buffer_x00134,in_ECX);
                                                        if ((dVar4 != 1.7e+308) || (NAN(dVar4))) {
                                                          pcVar1 = "17e307";
                                                          pcVar3 = "StrtodChar(\"0000000017\", 307)"
                                                          ;
                                                          uVar5 = 0x7fee42d130773b76;
                                                          uVar2 = 0xe1;
                                                        }
                                                        else {
                                                          buffer_x00135._8_8_ = 0x12f;
                                                          buffer_x00135.start_ = (char *)0x7;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc45d1e,buffer_x00135,
                                                                             in_ECX);
                                                          if (dVar4 < INFINITY) {
                                                            pcVar1 = "Double::Infinity()";
                                                            pcVar3 = "StrtodChar(\"1000000\", 303)";
                                                            uVar5 = 0x7ff0000000000000;
                                                            uVar2 = 0xe2;
                                                          }
                                                          else {
                                                            buffer_x00136._8_8_ = 0x12f;
                                                            buffer_x00136.start_ = (char *)0x6;
                                                            dVar4 = double_conversion::Strtod
                                                                              ((double_conversion *)
                                                                               0xc45d58,
                                                  buffer_x00136,in_ECX);
                                                  if ((dVar4 != 1e+308) || (NAN(dVar4))) {
                                                    pcVar1 = "1e308";
                                                    pcVar3 = "StrtodChar(\"100000\", 303)";
                                                    uVar5 = 0x7fe1ccf385ebc8a0;
                                                    uVar2 = 0xe3;
                                                  }
                                                  else {
                                                    buffer_x00137._8_8_ = 300;
                                                    buffer_x00137.start_ = (char *)0x9;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc45d8c
                                                                       ,buffer_x00137,in_ECX);
                                                    if ((dVar4 != 1.234e+308) || (NAN(dVar4))) {
                                                      pcVar1 = "1234e305";
                                                      pcVar3 = "StrtodChar(\"123400000\", 300)";
                                                      uVar5 = 0x7fe5f74721acaf61;
                                                      uVar2 = 0xe4;
                                                    }
                                                    else {
                                                      buffer_x00138._8_8_ = 299;
                                                      buffer_x00138.start_ = (char *)0x9;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc45d8c,buffer_x00138,
                                                                         in_ECX);
                                                      if ((dVar4 != 1.234e+307) || (NAN(dVar4))) {
                                                        pcVar1 = "1234e304";
                                                        pcVar3 = "StrtodChar(\"123400000\", 299)";
                                                        uVar5 = 0x7fb1929f4e23bf81;
                                                        uVar2 = 0xe5;
                                                      }
                                                      else {
                                                        buffer_x00139._8_8_ = 300;
                                                        buffer_x00139.start_ = (char *)0x9;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc45de7,buffer_x00139,
                                                                           in_ECX);
                                                        if (dVar4 < INFINITY) {
                                                          pcVar1 = "Double::Infinity()";
                                                          pcVar3 = "StrtodChar(\"180000000\", 300)";
                                                          uVar5 = 0x7ff0000000000000;
                                                          uVar2 = 0xe6;
                                                        }
                                                        else {
                                                          buffer_x00140._8_8_ = 300;
                                                          buffer_x00140.start_ = (char *)0x9;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc45e1e,buffer_x00140,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.7e+308) || (NAN(dVar4))) {
                                                            pcVar1 = "17e307";
                                                            pcVar3 = 
                                                  "StrtodChar(\"170000000\", 300)";
                                                  uVar5 = 0x7fee42d130773b76;
                                                  uVar2 = 0xe7;
                                                  }
                                                  else {
                                                    buffer_x00141._8_8_ = 0x12f;
                                                    buffer_x00141.start_ = (char *)0xe;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "00000001000000",
                                                                       buffer_x00141,in_ECX);
                                                    if (dVar4 < INFINITY) {
                                                      pcVar1 = "Double::Infinity()";
                                                      pcVar3 = "StrtodChar(\"00000001000000\", 303)"
                                                      ;
                                                      uVar5 = 0x7ff0000000000000;
                                                      uVar2 = 0xe8;
                                                    }
                                                    else {
                                                      buffer_x00142._8_8_ = 0x12f;
                                                      buffer_x00142.start_ = (char *)0x12;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         "000000000000100000",
                                                                         buffer_x00142,in_ECX);
                                                      if ((dVar4 != 1e+308) || (NAN(dVar4))) {
                                                        pcVar1 = "1e308";
                                                        pcVar3 = 
                                                  "StrtodChar(\"000000000000100000\", 303)";
                                                  uVar5 = 0x7fe1ccf385ebc8a0;
                                                  uVar2 = 0xe9;
                                                  }
                                                  else {
                                                    buffer_x00143._8_8_ = 300;
                                                    buffer_x00143.start_ = (char *)0x11;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "00000000123400000",
                                                                       buffer_x00143,in_ECX);
                                                    if ((dVar4 != 1.234e+308) || (NAN(dVar4))) {
                                                      pcVar1 = "1234e305";
                                                      pcVar3 = 
                                                  "StrtodChar(\"00000000123400000\", 300)";
                                                  uVar5 = 0x7fe5f74721acaf61;
                                                  uVar2 = 0xea;
                                                  }
                                                  else {
                                                    buffer_x00144._8_8_ = 299;
                                                    buffer_x00144.start_ = (char *)0x10;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc45d85
                                                                       ,buffer_x00144,in_ECX);
                                                    if ((dVar4 != 1.234e+307) || (NAN(dVar4))) {
                                                      pcVar1 = "1234e304";
                                                      pcVar3 = 
                                                  "StrtodChar(\"0000000123400000\", 299)";
                                                  uVar5 = 0x7fb1929f4e23bf81;
                                                  uVar2 = 0xeb;
                                                  }
                                                  else {
                                                    buffer_x00145._8_8_ = 300;
                                                    buffer_x00145.start_ = (char *)0x11;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "00000000180000000",
                                                                       buffer_x00145,in_ECX);
                                                    if (dVar4 < INFINITY) {
                                                      pcVar1 = "Double::Infinity()";
                                                      pcVar3 = 
                                                  "StrtodChar(\"00000000180000000\", 300)";
                                                  uVar5 = 0x7ff0000000000000;
                                                  uVar2 = 0xec;
                                                  }
                                                  else {
                                                    buffer_x00146._8_8_ = 300;
                                                    buffer_x00146.start_ = (char *)0x11;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "00000000170000000",
                                                                       buffer_x00146,in_ECX);
                                                    if ((dVar4 != 1.7e+308) || (NAN(dVar4))) {
                                                      pcVar1 = "17e307";
                                                      pcVar3 = 
                                                  "StrtodChar(\"00000000170000000\", 300)";
                                                  uVar5 = 0x7fee42d130773b76;
                                                  uVar2 = 0xed;
                                                  }
                                                  else {
                                                    buffer_x00147._8_8_ = 0x124;
                                                    buffer_x00147.start_ = (char *)0x11;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "17976931348623157",
                                                                       buffer_x00147,in_ECX);
                                                    if ((dVar4 != 1.79769313486232e+308) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1.7976931348623157E+308";
                                                      pcVar3 = 
                                                  "StrtodChar(\"17976931348623157\", 292)";
                                                  uVar5 = 0x7fefffffffffffff;
                                                  uVar2 = 0xee;
                                                  }
                                                  else {
                                                    buffer_x00148._8_8_ = 0x124;
                                                    buffer_x00148.start_ = (char *)0x11;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "17976931348623158",
                                                                       buffer_x00148,in_ECX);
                                                    if ((dVar4 != 1.79769313486232e+308) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1.7976931348623158E+308";
                                                      pcVar3 = 
                                                  "StrtodChar(\"17976931348623158\", 292)";
                                                  uVar5 = 0x7fefffffffffffff;
                                                  uVar2 = 0xef;
                                                  }
                                                  else {
                                                    buffer_x00149._8_8_ = 0x124;
                                                    buffer_x00149.start_ = (char *)0x11;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "17976931348623159",
                                                                       buffer_x00149,in_ECX);
                                                    if (dVar4 < INFINITY) {
                                                      pcVar1 = "Double::Infinity()";
                                                      pcVar3 = 
                                                  "StrtodChar(\"17976931348623159\", 292)";
                                                  uVar5 = 0x7ff0000000000000;
                                                  uVar2 = 0xf0;
                                                  }
                                                  else {
                                                    buffer_x00150._8_8_ = 0xffffffea;
                                                    buffer_x00150.start_ = (char *)0x5;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xaca64e
                                                                       ,buffer_x00150,in_ECX);
                                                    if ((dVar4 != 8.9255e-18) || (NAN(dVar4))) {
                                                      pcVar1 = "89255e-22";
                                                      pcVar3 = "StrtodChar(\"89255\", -22)";
                                                      uVar5 = 0x3c6494af6ce5221f;
                                                      uVar2 = 0xf6;
                                                    }
                                                    else {
                                                      buffer_x00151._8_8_ = 0xffffffdf;
                                                      buffer_x00151.start_ = (char *)0x9;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         "358416272",buffer_x00151,
                                                                         in_ECX);
                                                      if ((dVar4 != 3.58416272e-25) || (NAN(dVar4)))
                                                      {
                                                        pcVar1 = "358416272e-33";
                                                        pcVar3 = "StrtodChar(\"358416272\", -33)";
                                                        uVar5 = 0x3adbbb2a68c9d0b9;
                                                        uVar2 = 0xf9;
                                                      }
                                                      else {
                                                        buffer_x00152._8_8_ = 0xffffff1f;
                                                        buffer_x00152.start_ = (char *)0x15;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           "104110013277974872254",
                                                                           buffer_x00152,in_ECX);
                                                        if ((dVar4 != 1.0411001327797486e-205) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "104110013277974872254e-225";
                                                          pcVar3 = 
                                                  "StrtodChar(\"104110013277974872254\", -225)";
                                                  uVar5 = 0x1560b661a31987ae;
                                                  uVar2 = 0xfb;
                                                  }
                                                  else {
                                                    buffer_x00153._8_8_ = 0x6c;
                                                    buffer_x00153.start_ = (char *)0x9;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3d546
                                                                       ,buffer_x00153,in_ECX);
                                                    if ((dVar4 != 1.23456789e+116) || (NAN(dVar4)))
                                                    {
                                                      pcVar1 = "123456789e108";
                                                      pcVar3 = "StrtodChar(\"123456789\", 108)";
                                                      uVar5 = 0x580910eb67a174c5;
                                                      uVar2 = 0xfd;
                                                    }
                                                    else {
                                                      buffer_x00154._8_8_ = 0x6d;
                                                      buffer_x00154.start_ = (char *)0x9;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3d546,buffer_x00154,
                                                                         in_ECX);
                                                      if ((dVar4 != 1.23456789e+117) || (NAN(dVar4))
                                                         ) {
                                                        pcVar1 = "123456789e109";
                                                        pcVar3 = "StrtodChar(\"123456789\", 109)";
                                                        uVar5 = 0x583f55264189d1f6;
                                                        uVar2 = 0xfe;
                                                      }
                                                      else {
                                                        buffer_x00155._8_8_ = 0x6e;
                                                        buffer_x00155.start_ = (char *)0x9;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3d546,buffer_x00155,
                                                                           in_ECX);
                                                        if ((dVar4 != 1.23456789e+118) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "123456789e110";
                                                          pcVar3 = "StrtodChar(\"123456789\", 110)";
                                                          uVar5 = 0x58739537e8f6233a;
                                                          uVar2 = 0xff;
                                                        }
                                                        else {
                                                          buffer_x00156._8_8_ = 0x6f;
                                                          buffer_x00156.start_ = (char *)0x9;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3d546,buffer_x00156,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.23456789e+119) ||
                                                             (NAN(dVar4))) {
                                                            pcVar1 = "123456789e111";
                                                            pcVar3 = 
                                                  "StrtodChar(\"123456789\", 111)";
                                                  uVar5 = 0x58a87a85e333ac08;
                                                  uVar2 = 0x100;
                                                  }
                                                  else {
                                                    buffer_x00157._8_8_ = 0x70;
                                                    buffer_x00157.start_ = (char *)0x9;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)0xc3d546
                                                                       ,buffer_x00157,in_ECX);
                                                    if ((dVar4 != 1.23456789e+120) || (NAN(dVar4)))
                                                    {
                                                      pcVar1 = "123456789e112";
                                                      pcVar3 = "StrtodChar(\"123456789\", 112)";
                                                      uVar5 = 0x58de99275c00970b;
                                                      uVar2 = 0x101;
                                                    }
                                                    else {
                                                      buffer_x00158._8_8_ = 0x71;
                                                      buffer_x00158.start_ = (char *)0x9;
                                                      dVar4 = double_conversion::Strtod
                                                                        ((double_conversion *)
                                                                         0xc3d546,buffer_x00158,
                                                                         in_ECX);
                                                      if ((dVar4 != 1.23456789e+121) || (NAN(dVar4))
                                                         ) {
                                                        pcVar1 = "123456789e113";
                                                        pcVar3 = "StrtodChar(\"123456789\", 113)";
                                                        uVar5 = 0x59131fb899805e67;
                                                        uVar2 = 0x102;
                                                      }
                                                      else {
                                                        buffer_x00159._8_8_ = 0x72;
                                                        buffer_x00159.start_ = (char *)0x9;
                                                        dVar4 = double_conversion::Strtod
                                                                          ((double_conversion *)
                                                                           0xc3d546,buffer_x00159,
                                                                           in_ECX);
                                                        if ((dVar4 != 1.23456789e+122) ||
                                                           (NAN(dVar4))) {
                                                          pcVar1 = "123456789e114";
                                                          pcVar3 = "StrtodChar(\"123456789\", 114)";
                                                          uVar5 = 0x5947e7a6bfe07600;
                                                          uVar2 = 0x103;
                                                        }
                                                        else {
                                                          buffer_x00160._8_8_ = 0x73;
                                                          buffer_x00160.start_ = (char *)0x9;
                                                          dVar4 = double_conversion::Strtod
                                                                            ((double_conversion *)
                                                                             0xc3d546,buffer_x00160,
                                                                             in_ECX);
                                                          if ((dVar4 != 1.23456789e+123) ||
                                                             (NAN(dVar4))) {
                                                            pcVar1 = "123456789e115";
                                                            pcVar3 = 
                                                  "StrtodChar(\"123456789\", 115)";
                                                  uVar5 = 0x597de1906fd89380;
                                                  uVar2 = 0x104;
                                                  }
                                                  else {
                                                    buffer_x00161._8_8_ = 0x6c;
                                                    buffer_x00161.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789012345",
                                                                       buffer_x00161,in_ECX);
                                                    if ((dVar4 != 1.2345678901234568e+132) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789012345e108";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789012345\", 108)";
                                                  uVar5 = 0x5b5bd4363aa49df4;
                                                  uVar2 = 0x107;
                                                  }
                                                  else {
                                                    buffer_x00162._8_8_ = 0x6d;
                                                    buffer_x00162.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789012345",
                                                                       buffer_x00162,in_ECX);
                                                    if ((dVar4 != 1.234567890123457e+133) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789012345e109";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789012345\", 109)";
                                                  uVar5 = 0x5b9164a1e4a6e2b9;
                                                  uVar2 = 0x109;
                                                  }
                                                  else {
                                                    buffer_x00163._8_8_ = 0x6e;
                                                    buffer_x00163.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789012345",
                                                                       buffer_x00163,in_ECX);
                                                    if ((dVar4 != 1.2345678901234568e+134) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789012345e110";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789012345\", 110)";
                                                  uVar5 = 0x5bc5bdca5dd09b67;
                                                  uVar2 = 0x10b;
                                                  }
                                                  else {
                                                    buffer_x00164._8_8_ = 0x6f;
                                                    buffer_x00164.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789012345",
                                                                       buffer_x00164,in_ECX);
                                                    if ((dVar4 != 1.2345678901234567e+135) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789012345e111";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789012345\", 111)";
                                                  uVar5 = 0x5bfb2d3cf544c240;
                                                  uVar2 = 0x10d;
                                                  }
                                                  else {
                                                    buffer_x00165._8_8_ = 0x70;
                                                    buffer_x00165.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789012345",
                                                                       buffer_x00165,in_ECX);
                                                    if ((dVar4 != 1.2345678901234567e+136) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789012345e112";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789012345\", 112)";
                                                  uVar5 = 0x5c30fc46194af968;
                                                  uVar2 = 0x10f;
                                                  }
                                                  else {
                                                    buffer_x00166._8_8_ = 0x71;
                                                    buffer_x00166.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789012345",
                                                                       buffer_x00166,in_ECX);
                                                    if ((dVar4 != 1.2345678901234567e+137) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789012345e113";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789012345\", 113)";
                                                  uVar5 = 0x5c653b579f9db7c2;
                                                  uVar2 = 0x111;
                                                  }
                                                  else {
                                                    buffer_x00167._8_8_ = 0x72;
                                                    buffer_x00167.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789012345",
                                                                       buffer_x00167,in_ECX);
                                                    if ((dVar4 != 1.2345678901234568e+138) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789012345e114";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789012345\", 114)";
                                                  uVar5 = 0x5c9a8a2d878525b3;
                                                  uVar2 = 0x113;
                                                  }
                                                  else {
                                                    buffer_x00168._8_8_ = 0x73;
                                                    buffer_x00168.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789012345",
                                                                       buffer_x00168,in_ECX);
                                                    if ((dVar4 != 1.2345678901234568e+139) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789012345e115";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789012345\", 115)";
                                                  uVar5 = 0x5cd0965c74b33790;
                                                  uVar2 = 0x115;
                                                  }
                                                  else {
                                                    buffer_x00169._8_8_ = 0x6c;
                                                    buffer_x00169.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789052345",
                                                                       buffer_x00169,in_ECX);
                                                    if ((dVar4 != 1.2345678901234568e+132) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789052345e108";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789052345\", 108)";
                                                  uVar5 = 0x5b5bd4363aa49df4;
                                                  uVar2 = 0x118;
                                                  }
                                                  else {
                                                    buffer_x00170._8_8_ = 0x6d;
                                                    buffer_x00170.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789052345",
                                                                       buffer_x00170,in_ECX);
                                                    if ((dVar4 != 1.234567890123457e+133) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789052345e109";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789052345\", 109)";
                                                  uVar5 = 0x5b9164a1e4a6e2b9;
                                                  uVar2 = 0x11a;
                                                  }
                                                  else {
                                                    buffer_x00171._8_8_ = 0x6e;
                                                    buffer_x00171.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789052345",
                                                                       buffer_x00171,in_ECX);
                                                    if ((dVar4 != 1.2345678901234568e+134) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789052345e110";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789052345\", 110)";
                                                  uVar5 = 0x5bc5bdca5dd09b67;
                                                  uVar2 = 0x11c;
                                                  }
                                                  else {
                                                    buffer_x00172._8_8_ = 0x6f;
                                                    buffer_x00172.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789052345",
                                                                       buffer_x00172,in_ECX);
                                                    if ((dVar4 != 1.2345678901234567e+135) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789052345e111";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789052345\", 111)";
                                                  uVar5 = 0x5bfb2d3cf544c240;
                                                  uVar2 = 0x11e;
                                                  }
                                                  else {
                                                    buffer_x00173._8_8_ = 0x70;
                                                    buffer_x00173.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789052345",
                                                                       buffer_x00173,in_ECX);
                                                    if ((dVar4 != 1.2345678901234567e+136) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789052345e112";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789052345\", 112)";
                                                  uVar5 = 0x5c30fc46194af968;
                                                  uVar2 = 0x120;
                                                  }
                                                  else {
                                                    buffer_x00174._8_8_ = 0x71;
                                                    buffer_x00174.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789052345",
                                                                       buffer_x00174,in_ECX);
                                                    if ((dVar4 != 1.2345678901234567e+137) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789052345e113";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789052345\", 113)";
                                                  uVar5 = 0x5c653b579f9db7c2;
                                                  uVar2 = 0x122;
                                                  }
                                                  else {
                                                    buffer_x00175._8_8_ = 0x72;
                                                    buffer_x00175.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789052345",
                                                                       buffer_x00175,in_ECX);
                                                    if ((dVar4 != 1.2345678901234568e+138) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789052345e114";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789052345\", 114)";
                                                  uVar5 = 0x5c9a8a2d878525b3;
                                                  uVar2 = 0x124;
                                                  }
                                                  else {
                                                    buffer_x00176._8_8_ = 0x73;
                                                    buffer_x00176.start_ = (char *)0x19;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "1234567890123456789052345",
                                                                       buffer_x00176,in_ECX);
                                                    if ((dVar4 != 1.2345678901234568e+139) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "1234567890123456789052345e115";
                                                      pcVar3 = 
                                                  "StrtodChar(\"1234567890123456789052345\", 115)";
                                                  uVar5 = 0x5cd0965c74b33790;
                                                  uVar2 = 0x126;
                                                  }
                                                  else {
                                                    buffer_x00177._8_8_ = 0xfffffbf5;
                                                    buffer_x00177.start_ = (char *)0x30d;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "5445618932859895362967233318697132813618813095743952975439298223406969961560047552942717636670910728746893019786283454139917900193169748259349067524939840552682198095012176093045431437495773903922425632551857520884625114624126588173520906670968542074438852601438992904761759703022688483745081090292688986958251711580854575674815074162979705098246243690189880319928315307816832576838178256307401454285988871020923752587330172447966674453785790265533466496640456213871241930958703059911787722565044368663670643970181259143319016472430928902201239474588139233890135329130660705762320235358869874608541509790266400643191187286648422874774910682648288516244021893172769161449825765517353755844373640588822904791244190695299838293263075467057383813882521706545084301049855505888186560731"
                                                  ,buffer_x00177,in_ECX);
                                                  if ((dVar4 != 5.445618932859895e-255) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = "5.445618932859895e-255";
                                                    pcVar3 = 
                                                  "StrtodChar(\"5445618932859895362967233318697132813618813095743952975\" \"4392982234069699615600475529427176366709107287468930197\" \"8628345413991790019316974825934906752493984055268219809\" \"5012176093045431437495773903922425632551857520884625114\" \"6241265881735209066709685420744388526014389929047617597\" \"0302268848374508109029268898695825171158085457567481507\" \"4162979705098246243690189880319928315307816832576838178\" \"2563074014542859888710209237525873301724479666744537857\" \"9026553346649664045621387124193095870305991178772256504\" \"4368663670643970181259143319016472430928902201239474588\" \"1392338901353291306607057623202353588698746085415097902\" \"6640064319118728664842287477491068264828851624402189317\" \"2769161449825765517353755844373640588822904791244190695\" \"2998382932630754670573838138825217065450843010498555058\" \"88186560731\", -1035)"
                                                  ;
                                                  uVar5 = 0xb247108a0912700;
                                                  uVar2 = 0x137;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "72057594037927928",
                                                                       (Vector<const_char>)
                                                                       ZEXT816(0x11),in_ECX);
                                                    if ((dVar4 != 7.205759403792793e+16) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "72057594037927928.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"72057594037927928\", 0)";
                                                  uVar5 = 0x436fffffffffffff;
                                                  uVar2 = 0x13e;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "72057594037927936",
                                                                       (Vector<const_char>)
                                                                       ZEXT816(0x11),in_ECX);
                                                    if ((dVar4 != 7.205759403792794e+16) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "72057594037927936.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"72057594037927936\", 0)";
                                                  uVar5 = 0x4370000000000000;
                                                  uVar2 = 0x13f;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "72057594037927932",
                                                                       (Vector<const_char>)
                                                                       ZEXT816(0x11),in_ECX);
                                                    if ((dVar4 != 7.205759403792794e+16) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "72057594037927936.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"72057594037927932\", 0)";
                                                  uVar5 = 0x4370000000000000;
                                                  uVar2 = 0x140;
                                                  }
                                                  else {
                                                    buffer_x00178._8_8_ = 0xfffffffb;
                                                    buffer_x00178.start_ = (char *)0x16;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "7205759403792793199999",
                                                                       buffer_x00178,in_ECX);
                                                    if ((dVar4 != 7.205759403792793e+16) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "72057594037927928.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"7205759403792793199999\", -5)";
                                                  uVar5 = 0x436fffffffffffff;
                                                  uVar2 = 0x141;
                                                  }
                                                  else {
                                                    buffer_x00179._8_8_ = 0xfffffffb;
                                                    buffer_x00179.start_ = (char *)0x16;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "7205759403792793200001",
                                                                       buffer_x00179,in_ECX);
                                                    if ((dVar4 != 7.205759403792794e+16) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "72057594037927936.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"7205759403792793200001\", -5)";
                                                  uVar5 = 0x4370000000000000;
                                                  uVar2 = 0x142;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "9223372036854774784",
                                                                       (Vector<const_char>)
                                                                       ZEXT816(0x13),in_ECX);
                                                    if ((dVar4 != 9.223372036854775e+18) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "9223372036854774784.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"9223372036854774784\", 0)";
                                                  uVar5 = 0x43dfffffffffffff;
                                                  uVar2 = 0x147;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "9223372036854775808",
                                                                       (Vector<const_char>)
                                                                       ZEXT816(0x13),in_ECX);
                                                    if ((dVar4 != 9.223372036854776e+18) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "9223372036854775808.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"9223372036854775808\", 0)";
                                                  uVar5 = 0x43e0000000000000;
                                                  uVar2 = 0x148;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "9223372036854775296",
                                                                       (Vector<const_char>)
                                                                       ZEXT816(0x13),in_ECX);
                                                    if ((dVar4 != 9.223372036854776e+18) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "9223372036854775808.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"9223372036854775296\", 0)";
                                                  uVar5 = 0x43e0000000000000;
                                                  uVar2 = 0x149;
                                                  }
                                                  else {
                                                    buffer_x00180._8_8_ = 0xfffffffb;
                                                    buffer_x00180.start_ = (char *)0x18;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "922337203685477529599999",
                                                                       buffer_x00180,in_ECX);
                                                    if ((dVar4 != 9.223372036854775e+18) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "9223372036854774784.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"922337203685477529599999\", -5)";
                                                  uVar5 = 0x43dfffffffffffff;
                                                  uVar2 = 0x14a;
                                                  }
                                                  else {
                                                    buffer_x00181._8_8_ = 0xfffffffb;
                                                    buffer_x00181.start_ = (char *)0x18;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "922337203685477529600001",
                                                                       buffer_x00181,in_ECX);
                                                    if ((dVar4 != 9.223372036854776e+18) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "9223372036854775808.0";
                                                      pcVar3 = 
                                                  "StrtodChar(\"922337203685477529600001\", -5)";
                                                  uVar5 = 0x43e0000000000000;
                                                  uVar2 = 0x14b;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "10141204801825834086073718800384",
                                                  (Vector<const_char>)ZEXT816(0x20),in_ECX);
                                                  if ((dVar4 != 1.0141204801825834e+31) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = "10141204801825834086073718800384.0";
                                                    pcVar3 = 
                                                  "StrtodChar(\"10141204801825834086073718800384\", 0)"
                                                  ;
                                                  uVar5 = 0x465fffffffffffff;
                                                  uVar2 = 0x151;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "10141204801825835211973625643008",
                                                  (Vector<const_char>)ZEXT816(0x20),in_ECX);
                                                  if ((dVar4 != 1.0141204801825835e+31) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = "10141204801825835211973625643008.0";
                                                    pcVar3 = 
                                                  "StrtodChar(\"10141204801825835211973625643008\", 0)"
                                                  ;
                                                  uVar5 = 0x4660000000000000;
                                                  uVar2 = 0x153;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "10141204801825834649023672221696",
                                                  (Vector<const_char>)ZEXT816(0x20),in_ECX);
                                                  if ((dVar4 != 1.0141204801825835e+31) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = "10141204801825835211973625643008.0";
                                                    pcVar3 = 
                                                  "StrtodChar(\"10141204801825834649023672221696\", 0)"
                                                  ;
                                                  uVar5 = 0x4660000000000000;
                                                  uVar2 = 0x155;
                                                  }
                                                  else {
                                                    buffer_x00182._8_8_ = 0xfffffffb;
                                                    buffer_x00182.start_ = (char *)0x25;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "1014120480182583464902367222169599999",
                                                  buffer_x00182,in_ECX);
                                                  if ((dVar4 != 1.0141204801825834e+31) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = "10141204801825834086073718800384.0";
                                                    pcVar3 = 
                                                  "StrtodChar(\"1014120480182583464902367222169599999\", -5)"
                                                  ;
                                                  uVar5 = 0x465fffffffffffff;
                                                  uVar2 = 0x157;
                                                  }
                                                  else {
                                                    buffer_x00183._8_8_ = 0xfffffffb;
                                                    buffer_x00183.start_ = (char *)0x25;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "1014120480182583464902367222169600001",
                                                  buffer_x00183,in_ECX);
                                                  if ((dVar4 != 1.0141204801825835e+31) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = "10141204801825835211973625643008.0";
                                                    pcVar3 = 
                                                  "StrtodChar(\"1014120480182583464902367222169600001\", -5)"
                                                  ;
                                                  uVar5 = 0x4660000000000000;
                                                  uVar2 = 0x159;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "5708990770823838890407843763683279797179383808",
                                                  (Vector<const_char>)ZEXT816(0x2e),in_ECX);
                                                  if ((dVar4 != 5.708990770823839e+45) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = 
                                                  "5708990770823838890407843763683279797179383808.0"
                                                  ;
                                                  pcVar3 = 
                                                  "StrtodChar(\"5708990770823838890407843763683279797179383808\", 0)"
                                                  ;
                                                  uVar5 = 0x496fffffffffffff;
                                                  uVar2 = 0x160;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "5708990770823839524233143877797980545530986496",
                                                  (Vector<const_char>)ZEXT816(0x2e),in_ECX);
                                                  if ((dVar4 != 5.70899077082384e+45) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = 
                                                  "5708990770823839524233143877797980545530986496.0"
                                                  ;
                                                  pcVar3 = 
                                                  "StrtodChar(\"5708990770823839524233143877797980545530986496\", 0)"
                                                  ;
                                                  uVar5 = 0x4970000000000000;
                                                  uVar2 = 0x162;
                                                  }
                                                  else {
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "5708990770823839207320493820740630171355185152",
                                                  (Vector<const_char>)ZEXT816(0x2e),in_ECX);
                                                  if ((dVar4 != 5.70899077082384e+45) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = 
                                                  "5708990770823839524233143877797980545530986496.0"
                                                  ;
                                                  pcVar3 = 
                                                  "StrtodChar(\"5708990770823839207320493820740630171355185152\", 0)"
                                                  ;
                                                  uVar5 = 0x4970000000000000;
                                                  uVar2 = 0x164;
                                                  }
                                                  else {
                                                    buffer_x00184._8_8_ = 0xfffffffd;
                                                    buffer_x00184.start_ = (char *)0x31;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "5708990770823839207320493820740630171355185151999"
                                                  ,buffer_x00184,in_ECX);
                                                  if ((dVar4 != 5.708990770823839e+45) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = 
                                                  "5708990770823838890407843763683279797179383808.0"
                                                  ;
                                                  pcVar3 = 
                                                  "StrtodChar(\"5708990770823839207320493820740630171355185151999\", -3)"
                                                  ;
                                                  uVar5 = 0x496fffffffffffff;
                                                  uVar2 = 0x166;
                                                  }
                                                  else {
                                                    buffer_x00185._8_8_ = 0xfffffffd;
                                                    buffer_x00185.start_ = (char *)0x31;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "5708990770823839207320493820740630171355185152001"
                                                  ,buffer_x00185,in_ECX);
                                                  if ((dVar4 != 5.70899077082384e+45) ||
                                                     (NAN(dVar4))) {
                                                    pcVar1 = 
                                                  "5708990770823839524233143877797980545530986496.0"
                                                  ;
                                                  pcVar3 = 
                                                  "StrtodChar(\"5708990770823839207320493820740630171355185152001\", -3)"
                                                  ;
                                                  uVar5 = 0x4970000000000000;
                                                  uVar2 = 0x168;
                                                  }
                                                  else {
                                                    buffer_x00186._8_8_ = 0xfffffebc;
                                                    buffer_x00186.start_ = (char *)0x11;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                       "22250738585072011",
                                                                       buffer_x00186,in_ECX);
                                                    if ((dVar4 != 2.225073858507201e-308) ||
                                                       (NAN(dVar4))) {
                                                      pcVar1 = "2.225073858507201e-308";
                                                      pcVar3 = 
                                                  "StrtodChar(\"22250738585072011\", -324)";
                                                  uVar5 = 0xfffffffffffff;
                                                  uVar2 = 0x16c;
                                                  }
                                                  else {
                                                    buffer_x00187._8_8_ = 0xfffffbcc;
                                                    buffer_x00187.start_ = (char *)0x301;
                                                    dVar4 = double_conversion::Strtod
                                                                      ((double_conversion *)
                                                                                                                                              
                                                  "2225073858507201136057409796709131975934819546351645648023426109724822222021076945516529523908135087914149158913039621106870086438694594645527657207407820621743379988141063267329253552286881372149012981122451451889849057222307285255133155755015914397476397983411801999323962548289017107081850690630666655994938275772572015763062690663332647565300009245888316433037779791869612049497390377829704905051080609940730262937128958950003583799967207254304360284078895771796150945516748243471030702609144621572289880258182545180325707018860872113128079512233426288368622321503775666622503982534335974568884423900265498198385487948292206894721689831099698365846814022854243330660339850886445804001034933970427567186443383770486037861622771738545623065874679014086723327636718751"
                                                  ,buffer_x00187,in_ECX);
                                                  if ((dVar4 == 2.2250738585072014e-308) &&
                                                     (!NAN(dVar4))) {
                                                    return;
                                                  }
                                                  pcVar1 = "2.22507385850720138309e-308";
                                                  pcVar3 = 
                                                  "StrtodChar(\"22250738585072011360574097967091319759348195463516456480\" \"23426109724822222021076945516529523908135087914149158913\" \"03962110687008643869459464552765720740782062174337998814\" \"10632673292535522868813721490129811224514518898490572223\" \"07285255133155755015914397476397983411801999323962548289\" \"01710708185069063066665599493827577257201576306269066333\" \"26475653000092458883164330377797918696120494973903778297\" \"04905051080609940730262937128958950003583799967207254304\" \"36028407889577179615094551674824347103070260914462157228\" \"98802581825451803257070188608721131280795122334262883686\" \"22321503775666622503982534335974568884423900265498198385\" \"48794829220689472168983109969836584681402285424333066033\" \"98508864458040010349339704275671864433837704860378616227\" \"71738545623065874679014086723327636718751\", -1076)"
                                                  ;
                                                  uVar5 = 0x10000000000000;
                                                  uVar2 = 0x17b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",uVar5,dVar4,
         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-strtod.cc"
         ,uVar2,pcVar1,pcVar3);
  abort();
}

Assistant:

TEST(Strtod) {
  Vector<const char> vector;

  vector = StringToVector("0");
  CHECK_EQ(0.0, Strtod(vector, 1));
  CHECK_EQ(0.0, Strtod(vector, 2));
  CHECK_EQ(0.0, Strtod(vector, -2));
  CHECK_EQ(0.0, Strtod(vector, -999));
  CHECK_EQ(0.0, Strtod(vector, +999));

  vector = StringToVector("1");
  CHECK_EQ(1.0, Strtod(vector, 0));
  CHECK_EQ(10.0, Strtod(vector, 1));
  CHECK_EQ(100.0, Strtod(vector, 2));
  CHECK_EQ(1e20, Strtod(vector, 20));
  CHECK_EQ(1e22, Strtod(vector, 22));
  CHECK_EQ(1e23, Strtod(vector, 23));
  CHECK_EQ(1e35, Strtod(vector, 35));
  CHECK_EQ(1e36, Strtod(vector, 36));
  CHECK_EQ(1e37, Strtod(vector, 37));
  CHECK_EQ(1e-1, Strtod(vector, -1));
  CHECK_EQ(1e-2, Strtod(vector, -2));
  CHECK_EQ(1e-5, Strtod(vector, -5));
  CHECK_EQ(1e-20, Strtod(vector, -20));
  CHECK_EQ(1e-22, Strtod(vector, -22));
  CHECK_EQ(1e-23, Strtod(vector, -23));
  CHECK_EQ(1e-25, Strtod(vector, -25));
  CHECK_EQ(1e-39, Strtod(vector, -39));

  vector = StringToVector("2");
  CHECK_EQ(2.0, Strtod(vector, 0));
  CHECK_EQ(20.0, Strtod(vector, 1));
  CHECK_EQ(200.0, Strtod(vector, 2));
  CHECK_EQ(2e20, Strtod(vector, 20));
  CHECK_EQ(2e22, Strtod(vector, 22));
  CHECK_EQ(2e23, Strtod(vector, 23));
  CHECK_EQ(2e35, Strtod(vector, 35));
  CHECK_EQ(2e36, Strtod(vector, 36));
  CHECK_EQ(2e37, Strtod(vector, 37));
  CHECK_EQ(2e-1, Strtod(vector, -1));
  CHECK_EQ(2e-2, Strtod(vector, -2));
  CHECK_EQ(2e-5, Strtod(vector, -5));
  CHECK_EQ(2e-20, Strtod(vector, -20));
  CHECK_EQ(2e-22, Strtod(vector, -22));
  CHECK_EQ(2e-23, Strtod(vector, -23));
  CHECK_EQ(2e-25, Strtod(vector, -25));
  CHECK_EQ(2e-39, Strtod(vector, -39));

  vector = StringToVector("9");
  CHECK_EQ(9.0, Strtod(vector, 0));
  CHECK_EQ(90.0, Strtod(vector, 1));
  CHECK_EQ(900.0, Strtod(vector, 2));
  CHECK_EQ(9e20, Strtod(vector, 20));
  CHECK_EQ(9e22, Strtod(vector, 22));
  CHECK_EQ(9e23, Strtod(vector, 23));
  CHECK_EQ(9e35, Strtod(vector, 35));
  CHECK_EQ(9e36, Strtod(vector, 36));
  CHECK_EQ(9e37, Strtod(vector, 37));
  CHECK_EQ(9e-1, Strtod(vector, -1));
  CHECK_EQ(9e-2, Strtod(vector, -2));
  CHECK_EQ(9e-5, Strtod(vector, -5));
  CHECK_EQ(9e-20, Strtod(vector, -20));
  CHECK_EQ(9e-22, Strtod(vector, -22));
  CHECK_EQ(9e-23, Strtod(vector, -23));
  CHECK_EQ(9e-25, Strtod(vector, -25));
  CHECK_EQ(9e-39, Strtod(vector, -39));

  vector = StringToVector("12345");
  CHECK_EQ(12345.0, Strtod(vector, 0));
  CHECK_EQ(123450.0, Strtod(vector, 1));
  CHECK_EQ(1234500.0, Strtod(vector, 2));
  CHECK_EQ(12345e20, Strtod(vector, 20));
  CHECK_EQ(12345e22, Strtod(vector, 22));
  CHECK_EQ(12345e23, Strtod(vector, 23));
  CHECK_EQ(12345e30, Strtod(vector, 30));
  CHECK_EQ(12345e31, Strtod(vector, 31));
  CHECK_EQ(12345e32, Strtod(vector, 32));
  CHECK_EQ(12345e35, Strtod(vector, 35));
  CHECK_EQ(12345e36, Strtod(vector, 36));
  CHECK_EQ(12345e37, Strtod(vector, 37));
  CHECK_EQ(12345e-1, Strtod(vector, -1));
  CHECK_EQ(12345e-2, Strtod(vector, -2));
  CHECK_EQ(12345e-5, Strtod(vector, -5));
  CHECK_EQ(12345e-20, Strtod(vector, -20));
  CHECK_EQ(12345e-22, Strtod(vector, -22));
  CHECK_EQ(12345e-23, Strtod(vector, -23));
  CHECK_EQ(12345e-25, Strtod(vector, -25));
  CHECK_EQ(12345e-39, Strtod(vector, -39));

  vector = StringToVector("12345678901234");
  CHECK_EQ(12345678901234.0, Strtod(vector, 0));
  CHECK_EQ(123456789012340.0, Strtod(vector, 1));
  CHECK_EQ(1234567890123400.0, Strtod(vector, 2));
  CHECK_EQ(12345678901234e20, Strtod(vector, 20));
  CHECK_EQ(12345678901234e22, Strtod(vector, 22));
  CHECK_EQ(12345678901234e23, Strtod(vector, 23));
  CHECK_EQ(12345678901234e30, Strtod(vector, 30));
  CHECK_EQ(12345678901234e31, Strtod(vector, 31));
  CHECK_EQ(12345678901234e32, Strtod(vector, 32));
  CHECK_EQ(12345678901234e35, Strtod(vector, 35));
  CHECK_EQ(12345678901234e36, Strtod(vector, 36));
  CHECK_EQ(12345678901234e37, Strtod(vector, 37));
  CHECK_EQ(12345678901234e-1, Strtod(vector, -1));
  CHECK_EQ(12345678901234e-2, Strtod(vector, -2));
  CHECK_EQ(12345678901234e-5, Strtod(vector, -5));
  CHECK_EQ(12345678901234e-20, Strtod(vector, -20));
  CHECK_EQ(12345678901234e-22, Strtod(vector, -22));
  CHECK_EQ(12345678901234e-23, Strtod(vector, -23));
  CHECK_EQ(12345678901234e-25, Strtod(vector, -25));
  CHECK_EQ(12345678901234e-39, Strtod(vector, -39));

  vector = StringToVector("123456789012345");
  CHECK_EQ(123456789012345.0, Strtod(vector, 0));
  CHECK_EQ(1234567890123450.0, Strtod(vector, 1));
  CHECK_EQ(12345678901234500.0, Strtod(vector, 2));
  CHECK_EQ(123456789012345e20, Strtod(vector, 20));
  CHECK_EQ(123456789012345e22, Strtod(vector, 22));
  CHECK_EQ(123456789012345e23, Strtod(vector, 23));
  CHECK_EQ(123456789012345e35, Strtod(vector, 35));
  CHECK_EQ(123456789012345e36, Strtod(vector, 36));
  CHECK_EQ(123456789012345e37, Strtod(vector, 37));
  CHECK_EQ(123456789012345e39, Strtod(vector, 39));
  CHECK_EQ(123456789012345e-1, Strtod(vector, -1));
  CHECK_EQ(123456789012345e-2, Strtod(vector, -2));
  CHECK_EQ(123456789012345e-5, Strtod(vector, -5));
  CHECK_EQ(123456789012345e-20, Strtod(vector, -20));
  CHECK_EQ(123456789012345e-22, Strtod(vector, -22));
  CHECK_EQ(123456789012345e-23, Strtod(vector, -23));
  CHECK_EQ(123456789012345e-25, Strtod(vector, -25));
  CHECK_EQ(123456789012345e-39, Strtod(vector, -39));

  CHECK_EQ(0.0, StrtodChar("0", 12345));
  CHECK_EQ(0.0, StrtodChar("", 1324));
  CHECK_EQ(0.0, StrtodChar("000000000", 123));
  CHECK_EQ(0.0, StrtodChar("2", -324));
  CHECK_EQ(4e-324, StrtodChar("3", -324));
  // It would be more readable to put non-zero literals on the left side (i.e.
  //   CHECK_EQ(1e-325, StrtodChar("1", -325))), but then Gcc complains that
  // they are truncated to zero.
  CHECK_EQ(0.0, StrtodChar("1", -325));
  CHECK_EQ(0.0, StrtodChar("1", -325));
  CHECK_EQ(0.0, StrtodChar("20000", -328));
  CHECK_EQ(40000e-328, StrtodChar("30000", -328));
  CHECK_EQ(0.0, StrtodChar("10000", -329));
  CHECK_EQ(0.0, StrtodChar("90000", -329));
  CHECK_EQ(0.0, StrtodChar("000000001", -325));
  CHECK_EQ(0.0, StrtodChar("000000001", -325));
  CHECK_EQ(0.0, StrtodChar("0000000020000", -328));
  CHECK_EQ(40000e-328, StrtodChar("00000030000", -328));
  CHECK_EQ(0.0, StrtodChar("0000000010000", -329));
  CHECK_EQ(0.0, StrtodChar("0000000090000", -329));

  // It would be more readable to put the literals (and not Double::Infinity())
  // on the left side (i.e. CHECK_EQ(1e309, StrtodChar("1", 309))), but then Gcc
  // complains that the floating constant exceeds range of 'double'.
  CHECK_EQ(Double::Infinity(), StrtodChar("1", 309));
  CHECK_EQ(1e308, StrtodChar("1", 308));
  CHECK_EQ(1234e305, StrtodChar("1234", 305));
  CHECK_EQ(1234e304, StrtodChar("1234", 304));
  CHECK_EQ(Double::Infinity(), StrtodChar("18", 307));
  CHECK_EQ(17e307, StrtodChar("17", 307));
  CHECK_EQ(Double::Infinity(), StrtodChar("0000001", 309));
  CHECK_EQ(1e308, StrtodChar("00000001", 308));
  CHECK_EQ(1234e305, StrtodChar("00000001234", 305));
  CHECK_EQ(1234e304, StrtodChar("000000001234", 304));
  CHECK_EQ(Double::Infinity(), StrtodChar("0000000018", 307));
  CHECK_EQ(17e307, StrtodChar("0000000017", 307));
  CHECK_EQ(Double::Infinity(), StrtodChar("1000000", 303));
  CHECK_EQ(1e308, StrtodChar("100000", 303));
  CHECK_EQ(1234e305, StrtodChar("123400000", 300));
  CHECK_EQ(1234e304, StrtodChar("123400000", 299));
  CHECK_EQ(Double::Infinity(), StrtodChar("180000000", 300));
  CHECK_EQ(17e307, StrtodChar("170000000", 300));
  CHECK_EQ(Double::Infinity(), StrtodChar("00000001000000", 303));
  CHECK_EQ(1e308, StrtodChar("000000000000100000", 303));
  CHECK_EQ(1234e305, StrtodChar("00000000123400000", 300));
  CHECK_EQ(1234e304, StrtodChar("0000000123400000", 299));
  CHECK_EQ(Double::Infinity(), StrtodChar("00000000180000000", 300));
  CHECK_EQ(17e307, StrtodChar("00000000170000000", 300));
  CHECK_EQ(1.7976931348623157E+308, StrtodChar("17976931348623157", 292));
  CHECK_EQ(1.7976931348623158E+308, StrtodChar("17976931348623158", 292));
  CHECK_EQ(Double::Infinity(), StrtodChar("17976931348623159", 292));

  // The following number is the result of 89255.0/1e-22. Both floating-point
  // numbers can be accurately represented with doubles. However on Linux,x86
  // the floating-point stack is set to 80bits and the double-rounding
  // introduces an error.
  CHECK_EQ(89255e-22, StrtodChar("89255", -22));

  // Some random values.
  CHECK_EQ(358416272e-33, StrtodChar("358416272", -33));
  CHECK_EQ(104110013277974872254e-225,
           StrtodChar("104110013277974872254", -225));

  CHECK_EQ(123456789e108, StrtodChar("123456789", 108));
  CHECK_EQ(123456789e109, StrtodChar("123456789", 109));
  CHECK_EQ(123456789e110, StrtodChar("123456789", 110));
  CHECK_EQ(123456789e111, StrtodChar("123456789", 111));
  CHECK_EQ(123456789e112, StrtodChar("123456789", 112));
  CHECK_EQ(123456789e113, StrtodChar("123456789", 113));
  CHECK_EQ(123456789e114, StrtodChar("123456789", 114));
  CHECK_EQ(123456789e115, StrtodChar("123456789", 115));

  CHECK_EQ(1234567890123456789012345e108,
           StrtodChar("1234567890123456789012345", 108));
  CHECK_EQ(1234567890123456789012345e109,
           StrtodChar("1234567890123456789012345", 109));
  CHECK_EQ(1234567890123456789012345e110,
           StrtodChar("1234567890123456789012345", 110));
  CHECK_EQ(1234567890123456789012345e111,
           StrtodChar("1234567890123456789012345", 111));
  CHECK_EQ(1234567890123456789012345e112,
           StrtodChar("1234567890123456789012345", 112));
  CHECK_EQ(1234567890123456789012345e113,
           StrtodChar("1234567890123456789012345", 113));
  CHECK_EQ(1234567890123456789012345e114,
           StrtodChar("1234567890123456789012345", 114));
  CHECK_EQ(1234567890123456789012345e115,
           StrtodChar("1234567890123456789012345", 115));

  CHECK_EQ(1234567890123456789052345e108,
           StrtodChar("1234567890123456789052345", 108));
  CHECK_EQ(1234567890123456789052345e109,
           StrtodChar("1234567890123456789052345", 109));
  CHECK_EQ(1234567890123456789052345e110,
           StrtodChar("1234567890123456789052345", 110));
  CHECK_EQ(1234567890123456789052345e111,
           StrtodChar("1234567890123456789052345", 111));
  CHECK_EQ(1234567890123456789052345e112,
           StrtodChar("1234567890123456789052345", 112));
  CHECK_EQ(1234567890123456789052345e113,
           StrtodChar("1234567890123456789052345", 113));
  CHECK_EQ(1234567890123456789052345e114,
           StrtodChar("1234567890123456789052345", 114));
  CHECK_EQ(1234567890123456789052345e115,
           StrtodChar("1234567890123456789052345", 115));

  CHECK_EQ(5.445618932859895e-255,
           StrtodChar("5445618932859895362967233318697132813618813095743952975"
                      "4392982234069699615600475529427176366709107287468930197"
                      "8628345413991790019316974825934906752493984055268219809"
                      "5012176093045431437495773903922425632551857520884625114"
                      "6241265881735209066709685420744388526014389929047617597"
                      "0302268848374508109029268898695825171158085457567481507"
                      "4162979705098246243690189880319928315307816832576838178"
                      "2563074014542859888710209237525873301724479666744537857"
                      "9026553346649664045621387124193095870305991178772256504"
                      "4368663670643970181259143319016472430928902201239474588"
                      "1392338901353291306607057623202353588698746085415097902"
                      "6640064319118728664842287477491068264828851624402189317"
                      "2769161449825765517353755844373640588822904791244190695"
                      "2998382932630754670573838138825217065450843010498555058"
                      "88186560731", -1035));

  // Boundary cases. Boundaries themselves should round to even.
  //
  // 0x1FFFFFFFFFFFF * 2^3 = 72057594037927928
  //                   next: 72057594037927936
  //               boundary: 72057594037927932  should round up.
  CHECK_EQ(72057594037927928.0, StrtodChar("72057594037927928", 0));
  CHECK_EQ(72057594037927936.0, StrtodChar("72057594037927936", 0));
  CHECK_EQ(72057594037927936.0, StrtodChar("72057594037927932", 0));
  CHECK_EQ(72057594037927928.0, StrtodChar("7205759403792793199999", -5));
  CHECK_EQ(72057594037927936.0, StrtodChar("7205759403792793200001", -5));

  // 0x1FFFFFFFFFFFF * 2^10 = 9223372036854774784
  //                    next: 9223372036854775808
  //                boundary: 9223372036854775296 should round up.
  CHECK_EQ(9223372036854774784.0, StrtodChar("9223372036854774784", 0));
  CHECK_EQ(9223372036854775808.0, StrtodChar("9223372036854775808", 0));
  CHECK_EQ(9223372036854775808.0, StrtodChar("9223372036854775296", 0));
  CHECK_EQ(9223372036854774784.0, StrtodChar("922337203685477529599999", -5));
  CHECK_EQ(9223372036854775808.0, StrtodChar("922337203685477529600001", -5));

  // 0x1FFFFFFFFFFFF * 2^50 = 10141204801825834086073718800384
  //                    next: 10141204801825835211973625643008
  //                boundary: 10141204801825834649023672221696 should round up.
  CHECK_EQ(10141204801825834086073718800384.0,
           StrtodChar("10141204801825834086073718800384", 0));
  CHECK_EQ(10141204801825835211973625643008.0,
           StrtodChar("10141204801825835211973625643008", 0));
  CHECK_EQ(10141204801825835211973625643008.0,
           StrtodChar("10141204801825834649023672221696", 0));
  CHECK_EQ(10141204801825834086073718800384.0,
           StrtodChar("1014120480182583464902367222169599999", -5));
  CHECK_EQ(10141204801825835211973625643008.0,
           StrtodChar("1014120480182583464902367222169600001", -5));

  // 0x1FFFFFFFFFFFF * 2^99 = 5708990770823838890407843763683279797179383808
  //                    next: 5708990770823839524233143877797980545530986496
  //                boundary: 5708990770823839207320493820740630171355185152
  // The boundary should round up.
  CHECK_EQ(5708990770823838890407843763683279797179383808.0,
           StrtodChar("5708990770823838890407843763683279797179383808", 0));
  CHECK_EQ(5708990770823839524233143877797980545530986496.0,
           StrtodChar("5708990770823839524233143877797980545530986496", 0));
  CHECK_EQ(5708990770823839524233143877797980545530986496.0,
           StrtodChar("5708990770823839207320493820740630171355185152", 0));
  CHECK_EQ(5708990770823838890407843763683279797179383808.0,
           StrtodChar("5708990770823839207320493820740630171355185151999", -3));
  CHECK_EQ(5708990770823839524233143877797980545530986496.0,
           StrtodChar("5708990770823839207320493820740630171355185152001", -3));

  // The following test-cases got some public attention in early 2011 when they
  // sent Java and PHP into an infinite loop.
  CHECK_EQ(2.225073858507201e-308, StrtodChar("22250738585072011", -324));
  CHECK_EQ(2.22507385850720138309e-308,
           StrtodChar("22250738585072011360574097967091319759348195463516456480"
                      "23426109724822222021076945516529523908135087914149158913"
                      "03962110687008643869459464552765720740782062174337998814"
                      "10632673292535522868813721490129811224514518898490572223"
                      "07285255133155755015914397476397983411801999323962548289"
                      "01710708185069063066665599493827577257201576306269066333"
                      "26475653000092458883164330377797918696120494973903778297"
                      "04905051080609940730262937128958950003583799967207254304"
                      "36028407889577179615094551674824347103070260914462157228"
                      "98802581825451803257070188608721131280795122334262883686"
                      "22321503775666622503982534335974568884423900265498198385"
                      "48794829220689472168983109969836584681402285424333066033"
                      "98508864458040010349339704275671864433837704860378616227"
                      "71738545623065874679014086723327636718751", -1076));
}